

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::sse2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  undefined1 (*pauVar4) [12];
  Primitive *pPVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Primitive PVar14;
  undefined4 uVar15;
  Geometry *pGVar16;
  __int_type_conflict _Var17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined3 uVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined8 uVar30;
  undefined6 uVar31;
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  byte bVar53;
  uint uVar54;
  ulong uVar55;
  ulong uVar56;
  RTCFilterFunctionN p_Var57;
  RayHitK<4> *pRVar58;
  ulong uVar59;
  long lVar60;
  ulong uVar61;
  bool bVar62;
  uint uVar63;
  int iVar64;
  uint uVar65;
  int iVar66;
  uint uVar67;
  uint uVar68;
  short sVar69;
  undefined2 uVar107;
  float fVar70;
  float fVar108;
  float fVar109;
  vfloat_impl<4> p00;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar110;
  float fVar136;
  float fVar137;
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar138;
  float fVar149;
  float fVar150;
  vfloat4 v;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar151;
  float fVar159;
  float fVar160;
  vfloat4 v_1;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar182;
  float fVar208;
  float fVar209;
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar210;
  float fVar213;
  float fVar214;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar215;
  float fVar228;
  float fVar229;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar230;
  float fVar239;
  float fVar240;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar241;
  float fVar254;
  float fVar255;
  vfloat4 a;
  undefined1 auVar242 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar256;
  float fVar257;
  float fVar267;
  float fVar269;
  vfloat4 a_2;
  undefined1 auVar258 [16];
  undefined1 auVar261 [16];
  float fVar268;
  float fVar270;
  float fVar271;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar272;
  float fVar283;
  float fVar284;
  vfloat4 a_3;
  float fVar285;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar277 [16];
  float fVar286;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar298;
  float fVar301;
  float fVar304;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar294 [16];
  float fVar299;
  float fVar300;
  float fVar302;
  float fVar303;
  float fVar305;
  float fVar306;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  float fVar327;
  float fVar328;
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  undefined8 local_4f8;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  undefined1 local_3a8 [16];
  undefined1 (*local_390) [16];
  Primitive *local_388;
  ulong local_380;
  RTCFilterFunctionNArguments local_378;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  uint auStack_318 [4];
  uint local_308;
  uint uStack_304;
  uint uStack_300;
  uint uStack_2fc;
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float afStack_58 [10];
  undefined1 auVar103 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 uVar106;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  
  PVar14 = prim[1];
  uVar55 = (ulong)(byte)PVar14;
  lVar21 = uVar55 * 0x25;
  pPVar5 = prim + lVar21 + 6;
  fVar150 = *(float *)(pPVar5 + 0xc);
  fVar151 = (*(float *)(ray + k * 4) - *(float *)pPVar5) * fVar150;
  fVar159 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar5 + 4)) * fVar150;
  fVar160 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar5 + 8)) * fVar150;
  fVar138 = *(float *)(ray + k * 4 + 0x40) * fVar150;
  fVar149 = *(float *)(ray + k * 4 + 0x50) * fVar150;
  fVar150 = *(float *)(ray + k * 4 + 0x60) * fVar150;
  uVar15 = *(undefined4 *)(prim + uVar55 * 4 + 6);
  uVar106 = (undefined1)((uint)uVar15 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar15 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar15));
  uVar106 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar15,(char)uVar15);
  uVar56 = CONCAT62(uVar31,sVar69);
  auVar246._8_4_ = 0;
  auVar246._0_8_ = uVar56;
  auVar246._12_2_ = uVar107;
  auVar246._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar140._12_4_ = auVar246._12_4_;
  auVar140._8_2_ = 0;
  auVar140._0_8_ = uVar56;
  auVar140._10_2_ = uVar107;
  auVar71._10_6_ = auVar140._10_6_;
  auVar71._8_2_ = uVar107;
  auVar71._0_8_ = uVar56;
  uVar107 = (undefined2)uVar31;
  auVar32._4_8_ = auVar71._8_8_;
  auVar32._2_2_ = uVar107;
  auVar32._0_2_ = uVar107;
  fVar307 = (float)((int)sVar69 >> 8);
  fVar315 = (float)(auVar32._0_4_ >> 0x18);
  fVar319 = (float)(auVar71._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar55 * 5 + 6);
  uVar106 = (undefined1)((uint)uVar15 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar15 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar15));
  uVar106 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar15,(char)uVar15);
  uVar56 = CONCAT62(uVar31,sVar69);
  auVar113._8_4_ = 0;
  auVar113._0_8_ = uVar56;
  auVar113._12_2_ = uVar107;
  auVar113._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar112._12_4_ = auVar113._12_4_;
  auVar112._8_2_ = 0;
  auVar112._0_8_ = uVar56;
  auVar112._10_2_ = uVar107;
  auVar111._10_6_ = auVar112._10_6_;
  auVar111._8_2_ = uVar107;
  auVar111._0_8_ = uVar56;
  uVar107 = (undefined2)uVar31;
  auVar33._4_8_ = auVar111._8_8_;
  auVar33._2_2_ = uVar107;
  auVar33._0_2_ = uVar107;
  fVar161 = (float)((int)sVar69 >> 8);
  fVar174 = (float)(auVar33._0_4_ >> 0x18);
  fVar177 = (float)(auVar111._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar55 * 6 + 6);
  uVar106 = (undefined1)((uint)uVar15 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar15 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar15));
  uVar106 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar15,(char)uVar15);
  uVar56 = CONCAT62(uVar31,sVar69);
  auVar116._8_4_ = 0;
  auVar116._0_8_ = uVar56;
  auVar116._12_2_ = uVar107;
  auVar116._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._8_2_ = 0;
  auVar115._0_8_ = uVar56;
  auVar115._10_2_ = uVar107;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._8_2_ = uVar107;
  auVar114._0_8_ = uVar56;
  uVar107 = (undefined2)uVar31;
  auVar34._4_8_ = auVar114._8_8_;
  auVar34._2_2_ = uVar107;
  auVar34._0_2_ = uVar107;
  fVar210 = (float)((int)sVar69 >> 8);
  fVar213 = (float)(auVar34._0_4_ >> 0x18);
  fVar214 = (float)(auVar114._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar55 * 0xf + 6);
  uVar106 = (undefined1)((uint)uVar15 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar15 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar15));
  uVar106 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar15,(char)uVar15);
  uVar56 = CONCAT62(uVar31,sVar69);
  auVar119._8_4_ = 0;
  auVar119._0_8_ = uVar56;
  auVar119._12_2_ = uVar107;
  auVar119._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar118._12_4_ = auVar119._12_4_;
  auVar118._8_2_ = 0;
  auVar118._0_8_ = uVar56;
  auVar118._10_2_ = uVar107;
  auVar117._10_6_ = auVar118._10_6_;
  auVar117._8_2_ = uVar107;
  auVar117._0_8_ = uVar56;
  uVar107 = (undefined2)uVar31;
  auVar35._4_8_ = auVar117._8_8_;
  auVar35._2_2_ = uVar107;
  auVar35._0_2_ = uVar107;
  fVar70 = (float)((int)sVar69 >> 8);
  fVar108 = (float)(auVar35._0_4_ >> 0x18);
  fVar109 = (float)(auVar117._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + (ulong)(byte)PVar14 * 0x10 + 6);
  uVar106 = (undefined1)((uint)uVar15 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar15 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar15));
  uVar106 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar15,(char)uVar15);
  uVar56 = CONCAT62(uVar31,sVar69);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar56;
  auVar185._12_2_ = uVar107;
  auVar185._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar56;
  auVar184._10_2_ = uVar107;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar107;
  auVar183._0_8_ = uVar56;
  uVar107 = (undefined2)uVar31;
  auVar36._4_8_ = auVar183._8_8_;
  auVar36._2_2_ = uVar107;
  auVar36._0_2_ = uVar107;
  fVar215 = (float)((int)sVar69 >> 8);
  fVar228 = (float)(auVar36._0_4_ >> 0x18);
  fVar229 = (float)(auVar183._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + (ulong)(byte)PVar14 * 0x10 + uVar55 + 6);
  uVar106 = (undefined1)((uint)uVar15 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar15 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar15));
  uVar106 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar15,(char)uVar15);
  uVar56 = CONCAT62(uVar31,sVar69);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar56;
  auVar188._12_2_ = uVar107;
  auVar188._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar56;
  auVar187._10_2_ = uVar107;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar107;
  auVar186._0_8_ = uVar56;
  uVar107 = (undefined2)uVar31;
  auVar37._4_8_ = auVar186._8_8_;
  auVar37._2_2_ = uVar107;
  auVar37._0_2_ = uVar107;
  fVar241 = (float)((int)sVar69 >> 8);
  fVar254 = (float)(auVar37._0_4_ >> 0x18);
  fVar255 = (float)(auVar186._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar55 * 0x1a + 6);
  uVar106 = (undefined1)((uint)uVar15 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar15 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar15));
  uVar106 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar15,(char)uVar15);
  uVar56 = CONCAT62(uVar31,sVar69);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar56;
  auVar191._12_2_ = uVar107;
  auVar191._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar56;
  auVar190._10_2_ = uVar107;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar107;
  auVar189._0_8_ = uVar56;
  uVar107 = (undefined2)uVar31;
  auVar38._4_8_ = auVar189._8_8_;
  auVar38._2_2_ = uVar107;
  auVar38._0_2_ = uVar107;
  fVar230 = (float)((int)sVar69 >> 8);
  fVar239 = (float)(auVar38._0_4_ >> 0x18);
  fVar240 = (float)(auVar189._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar55 * 0x1b + 6);
  uVar106 = (undefined1)((uint)uVar15 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar15 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar15));
  uVar106 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar15,(char)uVar15);
  uVar56 = CONCAT62(uVar31,sVar69);
  auVar194._8_4_ = 0;
  auVar194._0_8_ = uVar56;
  auVar194._12_2_ = uVar107;
  auVar194._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._8_2_ = 0;
  auVar193._0_8_ = uVar56;
  auVar193._10_2_ = uVar107;
  auVar192._10_6_ = auVar193._10_6_;
  auVar192._8_2_ = uVar107;
  auVar192._0_8_ = uVar56;
  uVar107 = (undefined2)uVar31;
  auVar39._4_8_ = auVar192._8_8_;
  auVar39._2_2_ = uVar107;
  auVar39._0_2_ = uVar107;
  fVar256 = (float)((int)sVar69 >> 8);
  fVar267 = (float)(auVar39._0_4_ >> 0x18);
  fVar269 = (float)(auVar192._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar55 * 0x1c + 6);
  uVar106 = (undefined1)((uint)uVar15 >> 0x18);
  uVar107 = CONCAT11(uVar106,uVar106);
  uVar106 = (undefined1)((uint)uVar15 >> 0x10);
  uVar30 = CONCAT35(CONCAT21(uVar107,uVar106),CONCAT14(uVar106,uVar15));
  uVar106 = (undefined1)((uint)uVar15 >> 8);
  uVar31 = CONCAT51(CONCAT41((int)((ulong)uVar30 >> 0x20),uVar106),uVar106);
  sVar69 = CONCAT11((char)uVar15,(char)uVar15);
  uVar56 = CONCAT62(uVar31,sVar69);
  auVar197._8_4_ = 0;
  auVar197._0_8_ = uVar56;
  auVar197._12_2_ = uVar107;
  auVar197._14_2_ = uVar107;
  uVar107 = (undefined2)((ulong)uVar30 >> 0x20);
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._8_2_ = 0;
  auVar196._0_8_ = uVar56;
  auVar196._10_2_ = uVar107;
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._8_2_ = uVar107;
  auVar195._0_8_ = uVar56;
  uVar107 = (undefined2)uVar31;
  auVar40._4_8_ = auVar195._8_8_;
  auVar40._2_2_ = uVar107;
  auVar40._0_2_ = uVar107;
  fVar110 = (float)((int)sVar69 >> 8);
  fVar136 = (float)(auVar40._0_4_ >> 0x18);
  fVar137 = (float)(auVar195._8_4_ >> 0x18);
  fVar287 = fVar138 * fVar307 + fVar149 * fVar161 + fVar150 * fVar210;
  fVar298 = fVar138 * fVar315 + fVar149 * fVar174 + fVar150 * fVar213;
  fVar301 = fVar138 * fVar319 + fVar149 * fVar177 + fVar150 * fVar214;
  fVar304 = fVar138 * (float)(auVar140._12_4_ >> 0x18) +
            fVar149 * (float)(auVar112._12_4_ >> 0x18) + fVar150 * (float)(auVar115._12_4_ >> 0x18);
  fVar272 = fVar138 * fVar70 + fVar149 * fVar215 + fVar150 * fVar241;
  fVar283 = fVar138 * fVar108 + fVar149 * fVar228 + fVar150 * fVar254;
  fVar284 = fVar138 * fVar109 + fVar149 * fVar229 + fVar150 * fVar255;
  fVar285 = fVar138 * (float)(auVar118._12_4_ >> 0x18) +
            fVar149 * (float)(auVar184._12_4_ >> 0x18) + fVar150 * (float)(auVar187._12_4_ >> 0x18);
  fVar182 = fVar138 * fVar230 + fVar149 * fVar256 + fVar150 * fVar110;
  fVar208 = fVar138 * fVar239 + fVar149 * fVar267 + fVar150 * fVar136;
  fVar209 = fVar138 * fVar240 + fVar149 * fVar269 + fVar150 * fVar137;
  fVar138 = fVar138 * (float)(auVar190._12_4_ >> 0x18) +
            fVar149 * (float)(auVar193._12_4_ >> 0x18) + fVar150 * (float)(auVar196._12_4_ >> 0x18);
  fVar308 = fVar307 * fVar151 + fVar161 * fVar159 + fVar210 * fVar160;
  fVar315 = fVar315 * fVar151 + fVar174 * fVar159 + fVar213 * fVar160;
  fVar319 = fVar319 * fVar151 + fVar177 * fVar159 + fVar214 * fVar160;
  fVar323 = (float)(auVar140._12_4_ >> 0x18) * fVar151 +
            (float)(auVar112._12_4_ >> 0x18) * fVar159 + (float)(auVar115._12_4_ >> 0x18) * fVar160;
  fVar241 = fVar70 * fVar151 + fVar215 * fVar159 + fVar241 * fVar160;
  fVar254 = fVar108 * fVar151 + fVar228 * fVar159 + fVar254 * fVar160;
  fVar255 = fVar109 * fVar151 + fVar229 * fVar159 + fVar255 * fVar160;
  fVar307 = (float)(auVar118._12_4_ >> 0x18) * fVar151 +
            (float)(auVar184._12_4_ >> 0x18) * fVar159 + (float)(auVar187._12_4_ >> 0x18) * fVar160;
  fVar230 = fVar151 * fVar230 + fVar159 * fVar256 + fVar160 * fVar110;
  fVar239 = fVar151 * fVar239 + fVar159 * fVar267 + fVar160 * fVar136;
  fVar240 = fVar151 * fVar240 + fVar159 * fVar269 + fVar160 * fVar137;
  fVar256 = fVar151 * (float)(auVar190._12_4_ >> 0x18) +
            fVar159 * (float)(auVar193._12_4_ >> 0x18) + fVar160 * (float)(auVar196._12_4_ >> 0x18);
  fVar150 = (float)DAT_01f80d30;
  fVar70 = DAT_01f80d30._4_4_;
  fVar108 = DAT_01f80d30._8_4_;
  fVar109 = DAT_01f80d30._12_4_;
  uVar63 = -(uint)(fVar150 <= ABS(fVar287));
  uVar65 = -(uint)(fVar70 <= ABS(fVar298));
  uVar67 = -(uint)(fVar108 <= ABS(fVar301));
  uVar68 = -(uint)(fVar109 <= ABS(fVar304));
  auVar290._0_4_ = (uint)fVar287 & uVar63;
  auVar290._4_4_ = (uint)fVar298 & uVar65;
  auVar290._8_4_ = (uint)fVar301 & uVar67;
  auVar290._12_4_ = (uint)fVar304 & uVar68;
  auVar152._0_4_ = ~uVar63 & (uint)fVar150;
  auVar152._4_4_ = ~uVar65 & (uint)fVar70;
  auVar152._8_4_ = ~uVar67 & (uint)fVar108;
  auVar152._12_4_ = ~uVar68 & (uint)fVar109;
  auVar152 = auVar152 | auVar290;
  uVar63 = -(uint)(fVar150 <= ABS(fVar272));
  uVar65 = -(uint)(fVar70 <= ABS(fVar283));
  uVar67 = -(uint)(fVar108 <= ABS(fVar284));
  uVar68 = -(uint)(fVar109 <= ABS(fVar285));
  auVar273._0_4_ = (uint)fVar272 & uVar63;
  auVar273._4_4_ = (uint)fVar283 & uVar65;
  auVar273._8_4_ = (uint)fVar284 & uVar67;
  auVar273._12_4_ = (uint)fVar285 & uVar68;
  auVar211._0_4_ = ~uVar63 & (uint)fVar150;
  auVar211._4_4_ = ~uVar65 & (uint)fVar70;
  auVar211._8_4_ = ~uVar67 & (uint)fVar108;
  auVar211._12_4_ = ~uVar68 & (uint)fVar109;
  auVar211 = auVar211 | auVar273;
  uVar63 = -(uint)(fVar150 <= ABS(fVar182));
  uVar65 = -(uint)(fVar70 <= ABS(fVar208));
  uVar67 = -(uint)(fVar108 <= ABS(fVar209));
  uVar68 = -(uint)(fVar109 <= ABS(fVar138));
  auVar198._0_4_ = (uint)fVar182 & uVar63;
  auVar198._4_4_ = (uint)fVar208 & uVar65;
  auVar198._8_4_ = (uint)fVar209 & uVar67;
  auVar198._12_4_ = (uint)fVar138 & uVar68;
  auVar216._0_4_ = ~uVar63 & (uint)fVar150;
  auVar216._4_4_ = ~uVar65 & (uint)fVar70;
  auVar216._8_4_ = ~uVar67 & (uint)fVar108;
  auVar216._12_4_ = ~uVar68 & (uint)fVar109;
  auVar216 = auVar216 | auVar198;
  auVar71 = rcpps(_DAT_01f80d30,auVar152);
  fVar150 = auVar71._0_4_;
  fVar109 = auVar71._4_4_;
  fVar161 = auVar71._8_4_;
  fVar215 = auVar71._12_4_;
  fVar150 = (1.0 - auVar152._0_4_ * fVar150) * fVar150 + fVar150;
  fVar109 = (1.0 - auVar152._4_4_ * fVar109) * fVar109 + fVar109;
  fVar161 = (1.0 - auVar152._8_4_ * fVar161) * fVar161 + fVar161;
  fVar215 = (1.0 - auVar152._12_4_ * fVar215) * fVar215 + fVar215;
  auVar71 = rcpps(auVar71,auVar211);
  fVar70 = auVar71._0_4_;
  fVar110 = auVar71._4_4_;
  fVar174 = auVar71._8_4_;
  fVar228 = auVar71._12_4_;
  fVar70 = (1.0 - auVar211._0_4_ * fVar70) * fVar70 + fVar70;
  fVar110 = (1.0 - auVar211._4_4_ * fVar110) * fVar110 + fVar110;
  fVar174 = (1.0 - auVar211._8_4_ * fVar174) * fVar174 + fVar174;
  fVar228 = (1.0 - auVar211._12_4_ * fVar228) * fVar228 + fVar228;
  auVar71 = rcpps(auVar71,auVar216);
  fVar108 = auVar71._0_4_;
  fVar136 = auVar71._4_4_;
  fVar177 = auVar71._8_4_;
  fVar229 = auVar71._12_4_;
  fVar108 = (1.0 - auVar216._0_4_ * fVar108) * fVar108 + fVar108;
  fVar136 = (1.0 - auVar216._4_4_ * fVar136) * fVar136 + fVar136;
  fVar177 = (1.0 - auVar216._8_4_ * fVar177) * fVar177 + fVar177;
  fVar229 = (1.0 - auVar216._12_4_ * fVar229) * fVar229 + fVar229;
  fVar267 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar21 + 0x16)) *
            *(float *)(prim + lVar21 + 0x1a);
  uVar56 = *(ulong *)(prim + uVar55 * 7 + 6);
  uVar107 = (undefined2)(uVar56 >> 0x30);
  auVar248._8_4_ = 0;
  auVar248._0_8_ = uVar56;
  auVar248._12_2_ = uVar107;
  auVar248._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar56 >> 0x20);
  auVar72._12_4_ = auVar248._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar56;
  auVar72._10_2_ = uVar107;
  auVar142._10_6_ = auVar72._10_6_;
  auVar142._8_2_ = uVar107;
  auVar142._0_8_ = uVar56;
  uVar107 = (undefined2)(uVar56 >> 0x10);
  auVar41._4_8_ = auVar142._8_8_;
  auVar41._2_2_ = uVar107;
  auVar41._0_2_ = uVar107;
  fVar137 = (float)(auVar41._0_4_ >> 0x10);
  fVar182 = (float)(auVar142._8_4_ >> 0x10);
  uVar61 = *(ulong *)(prim + uVar55 * 0xb + 6);
  uVar107 = (undefined2)(uVar61 >> 0x30);
  auVar155._8_4_ = 0;
  auVar155._0_8_ = uVar61;
  auVar155._12_2_ = uVar107;
  auVar155._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar61 >> 0x20);
  auVar154._12_4_ = auVar155._12_4_;
  auVar154._8_2_ = 0;
  auVar154._0_8_ = uVar61;
  auVar154._10_2_ = uVar107;
  auVar153._10_6_ = auVar154._10_6_;
  auVar153._8_2_ = uVar107;
  auVar153._0_8_ = uVar61;
  uVar107 = (undefined2)(uVar61 >> 0x10);
  auVar42._4_8_ = auVar153._8_8_;
  auVar42._2_2_ = uVar107;
  auVar42._0_2_ = uVar107;
  uVar6 = *(ulong *)(prim + uVar55 * 9 + 6);
  uVar107 = (undefined2)(uVar6 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar6;
  auVar75._12_2_ = uVar107;
  auVar75._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar6 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar6;
  auVar74._10_2_ = uVar107;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar107;
  auVar73._0_8_ = uVar6;
  uVar107 = (undefined2)(uVar6 >> 0x10);
  auVar43._4_8_ = auVar73._8_8_;
  auVar43._2_2_ = uVar107;
  auVar43._0_2_ = uVar107;
  fVar138 = (float)(auVar43._0_4_ >> 0x10);
  fVar208 = (float)(auVar73._8_4_ >> 0x10);
  uVar7 = *(ulong *)(prim + uVar55 * 0xd + 6);
  uVar107 = (undefined2)(uVar7 >> 0x30);
  auVar219._8_4_ = 0;
  auVar219._0_8_ = uVar7;
  auVar219._12_2_ = uVar107;
  auVar219._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar7 >> 0x20);
  auVar218._12_4_ = auVar219._12_4_;
  auVar218._8_2_ = 0;
  auVar218._0_8_ = uVar7;
  auVar218._10_2_ = uVar107;
  auVar217._10_6_ = auVar218._10_6_;
  auVar217._8_2_ = uVar107;
  auVar217._0_8_ = uVar7;
  uVar107 = (undefined2)(uVar7 >> 0x10);
  auVar44._4_8_ = auVar217._8_8_;
  auVar44._2_2_ = uVar107;
  auVar44._0_2_ = uVar107;
  uVar8 = *(ulong *)(prim + uVar55 * 0x12 + 6);
  uVar107 = (undefined2)(uVar8 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar8;
  auVar78._12_2_ = uVar107;
  auVar78._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar8 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar8;
  auVar77._10_2_ = uVar107;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar107;
  auVar76._0_8_ = uVar8;
  uVar107 = (undefined2)(uVar8 >> 0x10);
  auVar45._4_8_ = auVar76._8_8_;
  auVar45._2_2_ = uVar107;
  auVar45._0_2_ = uVar107;
  fVar149 = (float)(auVar45._0_4_ >> 0x10);
  fVar209 = (float)(auVar76._8_4_ >> 0x10);
  uVar59 = (ulong)(uint)((int)(uVar55 * 5) << 2);
  uVar9 = *(ulong *)(prim + uVar55 * 2 + uVar59 + 6);
  uVar107 = (undefined2)(uVar9 >> 0x30);
  auVar244._8_4_ = 0;
  auVar244._0_8_ = uVar9;
  auVar244._12_2_ = uVar107;
  auVar244._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar9 >> 0x20);
  auVar243._12_4_ = auVar244._12_4_;
  auVar243._8_2_ = 0;
  auVar243._0_8_ = uVar9;
  auVar243._10_2_ = uVar107;
  auVar242._10_6_ = auVar243._10_6_;
  auVar242._8_2_ = uVar107;
  auVar242._0_8_ = uVar9;
  uVar107 = (undefined2)(uVar9 >> 0x10);
  auVar46._4_8_ = auVar242._8_8_;
  auVar46._2_2_ = uVar107;
  auVar46._0_2_ = uVar107;
  uVar59 = *(ulong *)(prim + uVar59 + 6);
  uVar107 = (undefined2)(uVar59 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar59;
  auVar81._12_2_ = uVar107;
  auVar81._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar59 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar59;
  auVar80._10_2_ = uVar107;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar107;
  auVar79._0_8_ = uVar59;
  uVar107 = (undefined2)(uVar59 >> 0x10);
  auVar47._4_8_ = auVar79._8_8_;
  auVar47._2_2_ = uVar107;
  auVar47._0_2_ = uVar107;
  fVar151 = (float)(auVar47._0_4_ >> 0x10);
  fVar210 = (float)(auVar79._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar55 * 0x18 + 6);
  uVar107 = (undefined2)(uVar10 >> 0x30);
  auVar260._8_4_ = 0;
  auVar260._0_8_ = uVar10;
  auVar260._12_2_ = uVar107;
  auVar260._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar10 >> 0x20);
  auVar259._12_4_ = auVar260._12_4_;
  auVar259._8_2_ = 0;
  auVar259._0_8_ = uVar10;
  auVar259._10_2_ = uVar107;
  auVar258._10_6_ = auVar259._10_6_;
  auVar258._8_2_ = uVar107;
  auVar258._0_8_ = uVar10;
  uVar107 = (undefined2)(uVar10 >> 0x10);
  auVar48._4_8_ = auVar258._8_8_;
  auVar48._2_2_ = uVar107;
  auVar48._0_2_ = uVar107;
  uVar11 = *(ulong *)(prim + uVar55 * 0x1d + 6);
  uVar107 = (undefined2)(uVar11 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar11;
  auVar84._12_2_ = uVar107;
  auVar84._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar11 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar11;
  auVar83._10_2_ = uVar107;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar107;
  auVar82._0_8_ = uVar11;
  uVar107 = (undefined2)(uVar11 >> 0x10);
  auVar49._4_8_ = auVar82._8_8_;
  auVar49._2_2_ = uVar107;
  auVar49._0_2_ = uVar107;
  fVar159 = (float)(auVar49._0_4_ >> 0x10);
  fVar213 = (float)(auVar82._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar55 + (ulong)(byte)PVar14 * 0x20 + 6);
  uVar107 = (undefined2)(uVar12 >> 0x30);
  auVar276._8_4_ = 0;
  auVar276._0_8_ = uVar12;
  auVar276._12_2_ = uVar107;
  auVar276._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar12 >> 0x20);
  auVar275._12_4_ = auVar276._12_4_;
  auVar275._8_2_ = 0;
  auVar275._0_8_ = uVar12;
  auVar275._10_2_ = uVar107;
  auVar274._10_6_ = auVar275._10_6_;
  auVar274._8_2_ = uVar107;
  auVar274._0_8_ = uVar12;
  uVar107 = (undefined2)(uVar12 >> 0x10);
  auVar50._4_8_ = auVar274._8_8_;
  auVar50._2_2_ = uVar107;
  auVar50._0_2_ = uVar107;
  uVar13 = *(ulong *)(prim + ((ulong)(byte)PVar14 * 0x20 - uVar55) + 6);
  uVar107 = (undefined2)(uVar13 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar13;
  auVar87._12_2_ = uVar107;
  auVar87._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar13 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar13;
  auVar86._10_2_ = uVar107;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar107;
  auVar85._0_8_ = uVar13;
  uVar107 = (undefined2)(uVar13 >> 0x10);
  auVar51._4_8_ = auVar85._8_8_;
  auVar51._2_2_ = uVar107;
  auVar51._0_2_ = uVar107;
  fVar160 = (float)(auVar51._0_4_ >> 0x10);
  fVar214 = (float)(auVar85._8_4_ >> 0x10);
  uVar55 = *(ulong *)(prim + uVar55 * 0x23 + 6);
  uVar107 = (undefined2)(uVar55 >> 0x30);
  auVar293._8_4_ = 0;
  auVar293._0_8_ = uVar55;
  auVar293._12_2_ = uVar107;
  auVar293._14_2_ = uVar107;
  uVar107 = (undefined2)(uVar55 >> 0x20);
  auVar292._12_4_ = auVar293._12_4_;
  auVar292._8_2_ = 0;
  auVar292._0_8_ = uVar55;
  auVar292._10_2_ = uVar107;
  auVar291._10_6_ = auVar292._10_6_;
  auVar291._8_2_ = uVar107;
  auVar291._0_8_ = uVar55;
  uVar107 = (undefined2)(uVar55 >> 0x10);
  auVar52._4_8_ = auVar291._8_8_;
  auVar52._2_2_ = uVar107;
  auVar52._0_2_ = uVar107;
  auVar156._0_8_ =
       CONCAT44(((((float)(auVar42._0_4_ >> 0x10) - fVar137) * fVar267 + fVar137) - fVar315) *
                fVar109,((((float)(int)(short)uVar61 - (float)(int)(short)uVar56) * fVar267 +
                         (float)(int)(short)uVar56) - fVar308) * fVar150);
  auVar156._8_4_ =
       ((((float)(auVar153._8_4_ >> 0x10) - fVar182) * fVar267 + fVar182) - fVar319) * fVar161;
  auVar156._12_4_ =
       ((((float)(auVar154._12_4_ >> 0x10) - (float)(auVar72._12_4_ >> 0x10)) * fVar267 +
        (float)(auVar72._12_4_ >> 0x10)) - fVar323) * fVar215;
  auVar220._0_4_ =
       ((((float)(int)(short)uVar7 - (float)(int)(short)uVar6) * fVar267 + (float)(int)(short)uVar6)
       - fVar308) * fVar150;
  auVar220._4_4_ =
       ((((float)(auVar44._0_4_ >> 0x10) - fVar138) * fVar267 + fVar138) - fVar315) * fVar109;
  auVar220._8_4_ =
       ((((float)(auVar217._8_4_ >> 0x10) - fVar208) * fVar267 + fVar208) - fVar319) * fVar161;
  auVar220._12_4_ =
       ((((float)(auVar218._12_4_ >> 0x10) - (float)(auVar74._12_4_ >> 0x10)) * fVar267 +
        (float)(auVar74._12_4_ >> 0x10)) - fVar323) * fVar215;
  auVar245._0_8_ =
       CONCAT44(((((float)(auVar46._0_4_ >> 0x10) - fVar149) * fVar267 + fVar149) - fVar254) *
                fVar110,((((float)(int)(short)uVar9 - (float)(int)(short)uVar8) * fVar267 +
                         (float)(int)(short)uVar8) - fVar241) * fVar70);
  auVar245._8_4_ =
       ((((float)(auVar242._8_4_ >> 0x10) - fVar209) * fVar267 + fVar209) - fVar255) * fVar174;
  auVar245._12_4_ =
       ((((float)(auVar243._12_4_ >> 0x10) - (float)(auVar77._12_4_ >> 0x10)) * fVar267 +
        (float)(auVar77._12_4_ >> 0x10)) - fVar307) * fVar228;
  auVar261._0_4_ =
       ((((float)(int)(short)uVar10 - (float)(int)(short)uVar59) * fVar267 +
        (float)(int)(short)uVar59) - fVar241) * fVar70;
  auVar261._4_4_ =
       ((((float)(auVar48._0_4_ >> 0x10) - fVar151) * fVar267 + fVar151) - fVar254) * fVar110;
  auVar261._8_4_ =
       ((((float)(auVar258._8_4_ >> 0x10) - fVar210) * fVar267 + fVar210) - fVar255) * fVar174;
  auVar261._12_4_ =
       ((((float)(auVar259._12_4_ >> 0x10) - (float)(auVar80._12_4_ >> 0x10)) * fVar267 +
        (float)(auVar80._12_4_ >> 0x10)) - fVar307) * fVar228;
  uVar15 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar277._0_8_ =
       CONCAT44(((((float)(auVar50._0_4_ >> 0x10) - fVar159) * fVar267 + fVar159) - fVar239) *
                fVar136,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar267 +
                         (float)(int)(short)uVar11) - fVar230) * fVar108);
  auVar277._8_4_ =
       ((((float)(auVar274._8_4_ >> 0x10) - fVar213) * fVar267 + fVar213) - fVar240) * fVar177;
  auVar277._12_4_ =
       ((((float)(auVar275._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar267 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar256) * fVar229;
  auVar294._0_4_ =
       ((((float)(int)(short)uVar55 - (float)(int)(short)uVar13) * fVar267 +
        (float)(int)(short)uVar13) - fVar230) * fVar108;
  auVar294._4_4_ =
       ((((float)(auVar52._0_4_ >> 0x10) - fVar160) * fVar267 + fVar160) - fVar239) * fVar136;
  auVar294._8_4_ =
       ((((float)(auVar291._8_4_ >> 0x10) - fVar214) * fVar267 + fVar214) - fVar240) * fVar177;
  auVar294._12_4_ =
       ((((float)(auVar292._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar267 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar256) * fVar229;
  auVar139._8_4_ = auVar156._8_4_;
  auVar139._0_8_ = auVar156._0_8_;
  auVar139._12_4_ = auVar156._12_4_;
  auVar140 = minps(auVar139,auVar220);
  auVar120._8_4_ = auVar245._8_4_;
  auVar120._0_8_ = auVar245._0_8_;
  auVar120._12_4_ = auVar245._12_4_;
  auVar71 = minps(auVar120,auVar261);
  auVar140 = maxps(auVar140,auVar71);
  auVar121._8_4_ = auVar277._8_4_;
  auVar121._0_8_ = auVar277._0_8_;
  auVar121._12_4_ = auVar277._12_4_;
  auVar71 = minps(auVar121,auVar294);
  auVar88._4_4_ = uVar15;
  auVar88._0_4_ = uVar15;
  auVar88._8_4_ = uVar15;
  auVar88._12_4_ = uVar15;
  auVar71 = maxps(auVar71,auVar88);
  auVar71 = maxps(auVar140,auVar71);
  auVar140 = maxps(auVar156,auVar220);
  auVar246 = maxps(auVar245,auVar261);
  auVar140 = minps(auVar140,auVar246);
  local_2e8 = auVar71._0_4_ * 0.99999964;
  fStack_2e4 = auVar71._4_4_ * 0.99999964;
  fStack_2e0 = auVar71._8_4_ * 0.99999964;
  fStack_2dc = auVar71._12_4_ * 0.99999964;
  auVar71 = maxps(auVar277,auVar294);
  uVar15 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar89._4_4_ = uVar15;
  auVar89._0_4_ = uVar15;
  auVar89._8_4_ = uVar15;
  auVar89._12_4_ = uVar15;
  auVar71 = minps(auVar71,auVar89);
  auVar71 = minps(auVar140,auVar71);
  uVar63 = (uint)(byte)PVar14;
  auVar122._0_4_ = -(uint)(uVar63 != 0 && local_2e8 <= auVar71._0_4_ * 1.0000004);
  auVar122._4_4_ = -(uint)(1 < uVar63 && fStack_2e4 <= auVar71._4_4_ * 1.0000004);
  auVar122._8_4_ = -(uint)(2 < uVar63 && fStack_2e0 <= auVar71._8_4_ * 1.0000004);
  auVar122._12_4_ = -(uint)(3 < uVar63 && fStack_2dc <= auVar71._12_4_ * 1.0000004);
  uVar63 = movmskps(uVar63,auVar122);
  if (uVar63 == 0) {
    return;
  }
  uVar63 = uVar63 & 0xff;
  local_390 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_288._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_288._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_288._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_288._12_4_ = 0;
  local_4f8 = ray;
  local_388 = prim;
LAB_00b53c13:
  lVar21 = 0;
  if ((ulong)uVar63 != 0) {
    for (; (uVar63 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
    }
  }
  uVar65 = *(uint *)(local_388 + 2);
  uVar67 = *(uint *)(local_388 + lVar21 * 4 + 6);
  pGVar16 = (context->scene->geometries).items[uVar65].ptr;
  fVar150 = pGVar16->fnumTimeSegments;
  fVar70 = (pGVar16->time_range).lower;
  fVar108 = ((*(float *)(ray + k * 4 + 0x70) - fVar70) / ((pGVar16->time_range).upper - fVar70)) *
            fVar150;
  fVar70 = floorf(fVar108);
  fVar150 = fVar150 + -1.0;
  if (fVar150 <= fVar70) {
    fVar70 = fVar150;
  }
  fVar150 = 0.0;
  if (0.0 <= fVar70) {
    fVar150 = fVar70;
  }
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar16->field_0x58 +
                           (ulong)uVar67 *
                           pGVar16[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var17 = pGVar16[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar60 = (long)(int)fVar150 * 0x38;
  lVar18 = *(long *)(_Var17 + lVar60);
  lVar19 = *(long *)(_Var17 + 0x10 + lVar60);
  pfVar3 = (float *)(lVar18 + lVar19 * uVar56);
  fVar70 = *pfVar3;
  fVar109 = pfVar3[1];
  fVar110 = pfVar3[2];
  fVar136 = pfVar3[3];
  lVar21 = uVar56 + 1;
  pauVar4 = (undefined1 (*) [12])(lVar18 + lVar19 * lVar21);
  auVar32 = *pauVar4;
  fVar137 = *(float *)pauVar4[1];
  lVar1 = uVar56 + 2;
  pfVar3 = (float *)(lVar18 + lVar19 * lVar1);
  fVar138 = *pfVar3;
  fVar149 = pfVar3[1];
  fVar151 = pfVar3[2];
  fVar159 = pfVar3[3];
  lVar2 = uVar56 + 3;
  pfVar3 = (float *)(lVar18 + lVar19 * lVar2);
  fVar160 = *pfVar3;
  fVar161 = pfVar3[1];
  fVar174 = pfVar3[2];
  fVar177 = pfVar3[3];
  lVar18 = *(long *)&pGVar16[4].fnumTimeSegments;
  lVar19 = *(long *)(lVar18 + lVar60);
  lVar20 = *(long *)(lVar18 + 0x10 + lVar60);
  pfVar3 = (float *)(lVar19 + lVar20 * uVar56);
  fVar182 = *pfVar3;
  fVar208 = pfVar3[1];
  fVar209 = pfVar3[2];
  fVar210 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar20 * lVar21);
  fVar213 = *pfVar3;
  fVar214 = pfVar3[1];
  fVar215 = pfVar3[2];
  fVar228 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar20 * lVar1);
  fVar229 = *pfVar3;
  fVar241 = pfVar3[1];
  fVar254 = pfVar3[2];
  fVar255 = pfVar3[3];
  fVar108 = fVar108 - fVar150;
  pfVar3 = (float *)(lVar19 + lVar20 * lVar2);
  fVar150 = *pfVar3;
  fVar307 = pfVar3[1];
  fVar230 = pfVar3[2];
  fVar239 = pfVar3[3];
  fVar272 = *(float *)*pauVar4 * 0.0;
  fVar284 = *(float *)(*pauVar4 + 4) * 0.0;
  fVar285 = *(float *)(*pauVar4 + 8) * 0.0;
  fVar309 = (fVar138 * 0.5 + fVar160 * 0.0 + fVar272) - fVar70 * 0.5;
  fVar316 = (fVar149 * 0.5 + fVar161 * 0.0 + fVar284) - fVar109 * 0.5;
  fVar320 = (fVar151 * 0.5 + fVar174 * 0.0 + fVar285) - fVar110 * 0.5;
  fVar324 = (fVar159 * 0.5 + fVar177 * 0.0 + fVar137 * 0.0) - fVar136 * 0.5;
  fVar304 = (fVar229 * 0.5 + fVar150 * 0.0 + fVar213 * 0.0) - fVar182 * 0.5;
  fVar315 = (fVar241 * 0.5 + fVar307 * 0.0 + fVar214 * 0.0) - fVar208 * 0.5;
  fVar319 = (fVar254 * 0.5 + fVar230 * 0.0 + fVar215 * 0.0) - fVar209 * 0.5;
  fVar323 = (fVar255 * 0.5 + fVar239 * 0.0 + fVar228 * 0.0) - fVar210 * 0.5;
  fVar240 = fVar138 * 0.0 + fVar160 * -0.0 + *(float *)*pauVar4 + fVar70 * -0.0;
  fVar256 = fVar149 * 0.0 + fVar161 * -0.0 + *(float *)(*pauVar4 + 4) + fVar109 * -0.0;
  fVar267 = fVar151 * 0.0 + fVar174 * -0.0 + *(float *)(*pauVar4 + 8) + fVar110 * -0.0;
  fVar269 = fVar159 * 0.0 + fVar177 * -0.0 + fVar137 + fVar136 * -0.0;
  fVar310 = fVar229 * 0.0 + fVar150 * -0.0 + fVar213 + fVar182 * -0.0;
  fVar317 = fVar241 * 0.0 + fVar307 * -0.0 + fVar214 + fVar208 * -0.0;
  fVar321 = fVar254 * 0.0 + fVar230 * -0.0 + fVar215 + fVar209 * -0.0;
  fVar325 = fVar255 * 0.0 + fVar239 * -0.0 + fVar228 + fVar210 * -0.0;
  fVar283 = fVar160 * -0.0 + fVar138 + fVar272 + fVar70 * -0.0;
  fVar284 = fVar161 * -0.0 + fVar149 + fVar284 + fVar109 * -0.0;
  fVar287 = fVar174 * -0.0 + fVar151 + fVar285 + fVar110 * -0.0;
  fVar298 = fVar177 * -0.0 + fVar159 + fVar137 * 0.0 + fVar136 * -0.0;
  local_4a8 = auVar32._0_4_;
  fStack_4a4 = auVar32._4_4_;
  fStack_4a0 = auVar32._8_4_;
  fVar272 = fVar70 * 0.0 + ((fVar160 * 0.5 + fVar138 * 0.0) - local_4a8 * 0.5);
  fVar285 = fVar109 * 0.0 + ((fVar161 * 0.5 + fVar149 * 0.0) - fStack_4a4 * 0.5);
  fVar301 = fVar110 * 0.0 + ((fVar174 * 0.5 + fVar151 * 0.0) - fStack_4a0 * 0.5);
  fVar308 = fVar136 * 0.0 + ((fVar177 * 0.5 + fVar159 * 0.0) - fVar137 * 0.5);
  fVar110 = fVar150 * -0.0 + fVar229 + fVar213 * 0.0 + fVar182 * -0.0;
  fVar136 = fVar307 * -0.0 + fVar241 + fVar214 * 0.0 + fVar208 * -0.0;
  fVar137 = fVar230 * -0.0 + fVar254 + fVar215 * 0.0 + fVar209 * -0.0;
  fVar138 = fVar239 * -0.0 + fVar255 + fVar228 * 0.0 + fVar210 * -0.0;
  fVar150 = fVar182 * 0.0 + ((fVar150 * 0.5 + fVar229 * 0.0) - fVar213 * 0.5);
  fVar70 = fVar208 * 0.0 + ((fVar307 * 0.5 + fVar241 * 0.0) - fVar214 * 0.5);
  fVar109 = fVar209 * 0.0 + ((fVar230 * 0.5 + fVar254 * 0.0) - fVar215 * 0.5);
  fVar182 = fVar210 * 0.0 + ((fVar239 * 0.5 + fVar255 * 0.0) - fVar228 * 0.5);
  fVar288 = fVar316 * fVar310 - fVar317 * fVar309;
  fVar299 = fVar320 * fVar317 - fVar321 * fVar316;
  fVar302 = fVar309 * fVar321 - fVar310 * fVar320;
  fVar305 = fVar324 * fVar325 - fVar325 * fVar324;
  fVar214 = fVar316 * fVar304 - fVar315 * fVar309;
  fVar228 = fVar320 * fVar315 - fVar319 * fVar316;
  fVar229 = fVar309 * fVar319 - fVar304 * fVar320;
  fVar307 = fVar285 * fVar110 - fVar136 * fVar272;
  fVar230 = fVar301 * fVar136 - fVar137 * fVar285;
  fVar239 = fVar272 * fVar137 - fVar110 * fVar301;
  fVar304 = fVar308 * fVar138 - fVar138 * fVar308;
  fVar209 = fVar285 * fVar150 - fVar70 * fVar272;
  fVar210 = fVar301 * fVar70 - fVar109 * fVar285;
  fVar213 = fVar272 * fVar109 - fVar150 * fVar301;
  fVar177 = fVar302 * fVar302 + fVar299 * fVar299 + fVar288 * fVar288;
  auVar140 = ZEXT416((uint)fVar177);
  auVar71 = rsqrtss(ZEXT416((uint)fVar177),auVar140);
  fVar150 = auVar71._0_4_;
  fVar315 = fVar150 * 1.5 - fVar150 * fVar150 * fVar177 * 0.5 * fVar150;
  fVar254 = fVar288 * fVar214 + fVar302 * fVar229 + fVar299 * fVar228;
  fVar241 = fVar305 * fVar315;
  auVar71 = rcpss(auVar140,auVar140);
  fVar255 = (2.0 - fVar177 * auVar71._0_4_) * auVar71._0_4_;
  fVar215 = fVar239 * fVar239 + fVar230 * fVar230 + fVar307 * fVar307;
  auVar140 = ZEXT416((uint)fVar215);
  auVar71 = rsqrtss(ZEXT416((uint)fVar215),auVar140);
  fVar150 = auVar71._0_4_;
  fVar325 = fVar150 * 1.5 - fVar150 * fVar150 * fVar215 * 0.5 * fVar150;
  fVar327 = fVar307 * fVar209 + fVar239 * fVar213 + fVar230 * fVar210;
  lVar19 = *(long *)(_Var17 + 0x38 + lVar60);
  lVar20 = *(long *)(_Var17 + 0x48 + lVar60);
  pauVar4 = (undefined1 (*) [12])(lVar19 + lVar20 * uVar56);
  auVar32 = *pauVar4;
  fVar150 = *(float *)pauVar4[1];
  pfVar3 = (float *)(lVar19 + lVar20 * lVar21);
  fVar70 = *pfVar3;
  fVar109 = pfVar3[1];
  fVar110 = pfVar3[2];
  fVar136 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar20 * lVar1);
  fVar137 = *pfVar3;
  fVar138 = pfVar3[1];
  fVar149 = pfVar3[2];
  fVar151 = pfVar3[3];
  auVar71 = rcpss(auVar140,auVar140);
  pfVar3 = (float *)(lVar19 + lVar20 * lVar2);
  fVar159 = *pfVar3;
  fVar160 = pfVar3[1];
  fVar161 = pfVar3[2];
  fVar174 = pfVar3[3];
  fVar208 = fVar304 * fVar325;
  fVar328 = (2.0 - fVar215 * auVar71._0_4_) * auVar71._0_4_;
  fVar311 = fVar269 * fVar299 * fVar315;
  fVar318 = fVar269 * fVar302 * fVar315;
  fVar322 = fVar269 * fVar288 * fVar315;
  fVar326 = fVar269 * fVar241;
  fVar319 = fVar240 - fVar311;
  fVar310 = fVar256 - fVar318;
  fVar317 = fVar267 - fVar322;
  fVar321 = fVar269 - fVar326;
  fVar289 = fVar269 * fVar255 * (fVar177 * fVar228 - fVar254 * fVar299) * fVar315 +
            fVar324 * fVar299 * fVar315;
  fVar300 = fVar269 * fVar255 * (fVar177 * fVar229 - fVar254 * fVar302) * fVar315 +
            fVar324 * fVar302 * fVar315;
  fVar303 = fVar269 * fVar255 * (fVar177 * fVar214 - fVar254 * fVar288) * fVar315 +
            fVar324 * fVar288 * fVar315;
  fVar306 = fVar269 * fVar255 * (fVar177 * (fVar324 * fVar323 - fVar323 * fVar324) -
                                fVar254 * fVar305) * fVar315 + fVar324 * fVar241;
  fVar311 = fVar311 + fVar240;
  fVar318 = fVar318 + fVar256;
  fVar322 = fVar322 + fVar267;
  fVar326 = fVar326 + fVar269;
  fVar240 = fVar298 * fVar230 * fVar325;
  fVar256 = fVar298 * fVar239 * fVar325;
  fVar267 = fVar298 * fVar307 * fVar325;
  fVar269 = fVar298 * fVar208;
  fVar323 = fVar283 - fVar240;
  fVar288 = fVar284 - fVar256;
  fVar299 = fVar287 - fVar267;
  fVar302 = fVar298 - fVar269;
  fVar162 = fVar298 * fVar328 * (fVar215 * fVar210 - fVar327 * fVar230) * fVar325 +
            fVar308 * fVar230 * fVar325;
  fVar175 = fVar298 * fVar328 * (fVar215 * fVar213 - fVar327 * fVar239) * fVar325 +
            fVar308 * fVar239 * fVar325;
  fVar178 = fVar298 * fVar328 * (fVar215 * fVar209 - fVar327 * fVar307) * fVar325 +
            fVar308 * fVar307 * fVar325;
  fVar180 = fVar298 * fVar328 * (fVar215 * (fVar308 * fVar182 - fVar182 * fVar308) -
                                fVar327 * fVar304) * fVar325 + fVar308 * fVar208;
  fVar240 = fVar240 + fVar283;
  fVar256 = fVar256 + fVar284;
  fVar267 = fVar267 + fVar287;
  fVar269 = fVar269 + fVar298;
  fVar163 = (fVar137 * 0.5 + fVar159 * 0.0 + fVar70 * 0.0) - *(float *)*pauVar4 * 0.5;
  fVar176 = (fVar138 * 0.5 + fVar160 * 0.0 + fVar109 * 0.0) - *(float *)(*pauVar4 + 4) * 0.5;
  fVar179 = (fVar149 * 0.5 + fVar161 * 0.0 + fVar110 * 0.0) - *(float *)(*pauVar4 + 8) * 0.5;
  fVar181 = (fVar151 * 0.5 + fVar174 * 0.0 + fVar136 * 0.0) - fVar150 * 0.5;
  lVar19 = *(long *)(lVar18 + 0x38 + lVar60);
  lVar18 = *(long *)(lVar18 + 0x48 + lVar60);
  pfVar3 = (float *)(lVar19 + lVar18 * lVar2);
  fVar177 = *pfVar3;
  fVar182 = pfVar3[1];
  fVar208 = pfVar3[2];
  fVar209 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar1 * lVar18);
  fVar210 = *pfVar3;
  fVar213 = pfVar3[1];
  fVar214 = pfVar3[2];
  fVar215 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar21 * lVar18);
  fVar228 = *pfVar3;
  fVar229 = pfVar3[1];
  fVar241 = pfVar3[2];
  fVar254 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + uVar56 * lVar18);
  fVar255 = *pfVar3;
  fVar307 = pfVar3[1];
  fVar230 = pfVar3[2];
  fVar239 = pfVar3[3];
  fVar257 = (fVar210 * 0.5 + fVar177 * 0.0 + fVar228 * 0.0) - fVar255 * 0.5;
  fVar268 = (fVar213 * 0.5 + fVar182 * 0.0 + fVar229 * 0.0) - fVar307 * 0.5;
  fVar270 = (fVar214 * 0.5 + fVar208 * 0.0 + fVar241 * 0.0) - fVar230 * 0.5;
  fVar271 = (fVar215 * 0.5 + fVar209 * 0.0 + fVar254 * 0.0) - fVar239 * 0.5;
  local_4a8 = auVar32._0_4_;
  fStack_4a4 = auVar32._4_4_;
  fStack_4a0 = auVar32._8_4_;
  fVar325 = fVar137 * 0.0 + fVar159 * -0.0 + fVar70 + local_4a8 * -0.0;
  fVar305 = fVar138 * 0.0 + fVar160 * -0.0 + fVar109 + fStack_4a4 * -0.0;
  fVar327 = fVar149 * 0.0 + fVar161 * -0.0 + fVar110 + fStack_4a0 * -0.0;
  fVar328 = fVar151 * 0.0 + fVar174 * -0.0 + fVar136 + fVar150 * -0.0;
  fVar283 = fVar159 * -0.0 + fVar137 + fVar70 * 0.0 + local_4a8 * -0.0;
  fVar287 = fVar160 * -0.0 + fVar138 + fVar109 * 0.0 + fStack_4a4 * -0.0;
  fVar304 = fVar161 * -0.0 + fVar149 + fVar110 * 0.0 + fStack_4a0 * -0.0;
  fVar315 = fVar174 * -0.0 + fVar151 + fVar136 * 0.0 + fVar150 * -0.0;
  fVar284 = local_4a8 * 0.0 + ((fVar159 * 0.5 + fVar137 * 0.0) - fVar70 * 0.5);
  fVar298 = fStack_4a4 * 0.0 + ((fVar160 * 0.5 + fVar138 * 0.0) - fVar109 * 0.5);
  fVar70 = fStack_4a0 * 0.0 + ((fVar161 * 0.5 + fVar149 * 0.0) - fVar110 * 0.5);
  fVar150 = fVar150 * 0.0 + ((fVar174 * 0.5 + fVar151 * 0.0) - fVar136 * 0.5);
  fVar109 = fVar210 * 0.0 + fVar177 * -0.0 + fVar228 + fVar255 * -0.0;
  fVar149 = fVar213 * 0.0 + fVar182 * -0.0 + fVar229 + fVar307 * -0.0;
  fVar151 = fVar214 * 0.0 + fVar208 * -0.0 + fVar241 + fVar230 * -0.0;
  fVar159 = fVar215 * 0.0 + fVar209 * -0.0 + fVar254 + fVar239 * -0.0;
  fVar110 = fVar177 * -0.0 + fVar210 + fVar228 * 0.0 + fVar255 * -0.0;
  fVar136 = fVar182 * -0.0 + fVar213 + fVar229 * 0.0 + fVar307 * -0.0;
  fVar137 = fVar208 * -0.0 + fVar214 + fVar241 * 0.0 + fVar230 * -0.0;
  fVar138 = fVar209 * -0.0 + fVar215 + fVar254 * 0.0 + fVar239 * -0.0;
  fVar177 = fVar255 * 0.0 + ((fVar177 * 0.5 + fVar210 * 0.0) - fVar228 * 0.5);
  fVar182 = fVar307 * 0.0 + ((fVar182 * 0.5 + fVar213 * 0.0) - fVar229 * 0.5);
  fVar208 = fVar230 * 0.0 + ((fVar208 * 0.5 + fVar214 * 0.0) - fVar241 * 0.5);
  fVar255 = fVar239 * 0.0 + ((fVar209 * 0.5 + fVar215 * 0.0) - fVar254 * 0.5);
  fVar209 = fVar176 * fVar109 - fVar149 * fVar163;
  fVar210 = fVar179 * fVar149 - fVar151 * fVar176;
  fVar213 = fVar163 * fVar151 - fVar109 * fVar179;
  fVar214 = fVar181 * fVar159 - fVar159 * fVar181;
  fVar109 = fVar176 * fVar257 - fVar268 * fVar163;
  fVar159 = fVar179 * fVar268 - fVar270 * fVar176;
  fVar161 = fVar163 * fVar270 - fVar257 * fVar179;
  fVar149 = fVar298 * fVar110 - fVar136 * fVar284;
  fVar151 = fVar70 * fVar136 - fVar137 * fVar298;
  fVar160 = fVar284 * fVar137 - fVar110 * fVar70;
  fVar174 = fVar150 * fVar138 - fVar138 * fVar150;
  fVar136 = fVar298 * fVar177 - fVar182 * fVar284;
  fVar137 = fVar70 * fVar182 - fVar208 * fVar298;
  fVar138 = fVar284 * fVar208 - fVar177 * fVar70;
  fVar182 = fVar213 * fVar213 + fVar210 * fVar210 + fVar209 * fVar209;
  auVar71 = ZEXT416((uint)fVar182);
  auVar140 = rsqrtss(ZEXT416((uint)fVar182),auVar71);
  fVar110 = auVar140._0_4_;
  fVar208 = fVar110 * 1.5 - fVar110 * fVar110 * fVar182 * 0.5 * fVar110;
  fVar254 = fVar209 * fVar109 + fVar213 * fVar161 + fVar210 * fVar159;
  auVar71 = rcpss(auVar71,auVar71);
  fVar110 = (2.0 - fVar182 * auVar71._0_4_) * auVar71._0_4_;
  fVar177 = fVar214 * fVar208;
  fVar307 = fVar160 * fVar160 + fVar151 * fVar151 + fVar149 * fVar149;
  auVar71 = ZEXT416((uint)fVar307);
  auVar140 = rsqrtss(ZEXT416((uint)fVar307),auVar71);
  fVar215 = auVar140._0_4_;
  fVar239 = fVar215 * 1.5 - fVar215 * fVar215 * fVar307 * 0.5 * fVar215;
  fVar257 = fVar149 * fVar136 + fVar160 * fVar138 + fVar151 * fVar137;
  auVar71 = rcpss(auVar71,auVar71);
  fVar268 = (2.0 - fVar307 * auVar71._0_4_) * auVar71._0_4_;
  fVar230 = fVar174 * fVar239;
  fVar215 = fVar328 * fVar210 * fVar208;
  fVar228 = fVar328 * fVar213 * fVar208;
  fVar229 = fVar328 * fVar209 * fVar208;
  fVar241 = fVar328 * fVar177;
  fVar159 = fVar328 * fVar110 * (fVar182 * fVar159 - fVar254 * fVar210) * fVar208 +
            fVar181 * fVar210 * fVar208;
  fVar161 = fVar328 * fVar110 * (fVar182 * fVar161 - fVar254 * fVar213) * fVar208 +
            fVar181 * fVar213 * fVar208;
  fVar213 = fVar328 * fVar110 * (fVar182 * fVar109 - fVar254 * fVar209) * fVar208 +
            fVar181 * fVar209 * fVar208;
  fVar214 = fVar328 * fVar110 * (fVar182 * (fVar181 * fVar271 - fVar271 * fVar181) -
                                fVar254 * fVar214) * fVar208 + fVar181 * fVar177;
  fVar177 = fVar325 - fVar215;
  fVar182 = fVar305 - fVar228;
  fVar208 = fVar327 - fVar229;
  fVar254 = fVar328 - fVar241;
  fVar215 = fVar215 + fVar325;
  fVar228 = fVar228 + fVar305;
  fVar229 = fVar229 + fVar327;
  fVar241 = fVar241 + fVar328;
  fVar209 = fVar315 * fVar151 * fVar239;
  fVar210 = fVar315 * fVar160 * fVar239;
  fVar109 = fVar315 * fVar149 * fVar239;
  fVar110 = fVar315 * fVar230;
  fVar325 = fVar315 * fVar268 * (fVar307 * fVar137 - fVar257 * fVar151) * fVar239 +
            fVar150 * fVar151 * fVar239;
  fVar327 = fVar315 * fVar268 * (fVar307 * fVar138 - fVar257 * fVar160) * fVar239 +
            fVar150 * fVar160 * fVar239;
  fVar328 = fVar315 * fVar268 * (fVar307 * fVar136 - fVar257 * fVar149) * fVar239 +
            fVar150 * fVar149 * fVar239;
  fVar257 = fVar315 * fVar268 * (fVar307 * (fVar150 * fVar255 - fVar255 * fVar150) -
                                fVar257 * fVar174) * fVar239 + fVar150 * fVar230;
  fVar136 = fVar283 - fVar209;
  fVar137 = fVar287 - fVar210;
  fVar138 = fVar304 - fVar109;
  fVar149 = fVar315 - fVar110;
  fVar209 = fVar209 + fVar283;
  fVar210 = fVar210 + fVar287;
  fVar109 = fVar109 + fVar304;
  fVar110 = fVar110 + fVar315;
  fVar305 = 1.0 - fVar108;
  fVar268 = fVar319 * fVar305 + fVar177 * fVar108;
  fVar270 = fVar310 * fVar305 + fVar182 * fVar108;
  fVar271 = fVar317 * fVar305 + fVar208 * fVar108;
  fVar286 = fVar321 * fVar305 + fVar254 * fVar108;
  fVar312 = ((fVar309 - fVar289) * 0.33333334 + fVar319) * fVar305 +
            ((fVar163 - fVar159) * 0.33333334 + fVar177) * fVar108;
  fVar310 = ((fVar316 - fVar300) * 0.33333334 + fVar310) * fVar305 +
            ((fVar176 - fVar161) * 0.33333334 + fVar182) * fVar108;
  fVar317 = ((fVar320 - fVar303) * 0.33333334 + fVar317) * fVar305 +
            ((fVar179 - fVar213) * 0.33333334 + fVar208) * fVar108;
  fVar321 = ((fVar324 - fVar306) * 0.33333334 + fVar321) * fVar305 +
            ((fVar181 - fVar214) * 0.33333334 + fVar254) * fVar108;
  fVar254 = (fVar323 - (fVar272 - fVar162) * 0.33333334) * fVar305 +
            (fVar136 - (fVar284 - fVar325) * 0.33333334) * fVar108;
  fVar255 = (fVar288 - (fVar285 - fVar175) * 0.33333334) * fVar305 +
            (fVar137 - (fVar298 - fVar327) * 0.33333334) * fVar108;
  fVar307 = (fVar299 - (fVar301 - fVar178) * 0.33333334) * fVar305 +
            (fVar138 - (fVar70 - fVar328) * 0.33333334) * fVar108;
  fVar230 = (fVar302 - (fVar308 - fVar180) * 0.33333334) * fVar305 +
            (fVar149 - (fVar150 - fVar257) * 0.33333334) * fVar108;
  fVar174 = fVar323 * fVar305 + fVar136 * fVar108;
  fVar177 = fVar288 * fVar305 + fVar137 * fVar108;
  fVar182 = fVar299 * fVar305 + fVar138 * fVar108;
  fVar208 = fVar302 * fVar305 + fVar149 * fVar108;
  fVar138 = fVar311 * fVar305 + fVar215 * fVar108;
  fVar149 = fVar318 * fVar305 + fVar228 * fVar108;
  fVar151 = fVar322 * fVar305 + fVar229 * fVar108;
  fVar160 = fVar326 * fVar305 + fVar241 * fVar108;
  fVar239 = ((fVar289 + fVar309) * 0.33333334 + fVar311) * fVar305 +
            ((fVar159 + fVar163) * 0.33333334 + fVar215) * fVar108;
  fVar283 = ((fVar300 + fVar316) * 0.33333334 + fVar318) * fVar305 +
            ((fVar161 + fVar176) * 0.33333334 + fVar228) * fVar108;
  fVar287 = ((fVar303 + fVar320) * 0.33333334 + fVar322) * fVar305 +
            ((fVar213 + fVar179) * 0.33333334 + fVar229) * fVar108;
  fVar319 = ((fVar306 + fVar324) * 0.33333334 + fVar326) * fVar305 +
            ((fVar214 + fVar181) * 0.33333334 + fVar241) * fVar108;
  fVar159 = (fVar267 - (fVar178 + fVar301) * 0.33333334) * fVar305 +
            (fVar109 - (fVar328 + fVar70) * 0.33333334) * fVar108;
  fVar161 = (fVar269 - (fVar180 + fVar308) * 0.33333334) * fVar305 +
            (fVar110 - (fVar257 + fVar150) * 0.33333334) * fVar108;
  local_298 = fVar305 * fVar240 + fVar108 * fVar209;
  fStack_294 = fVar305 * fVar256 + fVar108 * fVar210;
  fStack_290 = fVar305 * fVar267 + fVar108 * fVar109;
  fStack_28c = fVar305 * fVar269 + fVar108 * fVar110;
  local_1c8 = *(float *)(local_4f8 + k * 4);
  fStack_1c4 = *(float *)(local_4f8 + k * 4 + 0x10);
  fStack_1c0 = *(float *)(local_4f8 + k * 4 + 0x20);
  local_158 = fVar268 - local_1c8;
  fStack_154 = fVar270 - fStack_1c4;
  fStack_150 = fVar271 - fStack_1c0;
  fStack_14c = fVar286 - 0.0;
  fVar150 = pre->ray_space[k].vx.field_0.m128[0];
  fVar70 = pre->ray_space[k].vx.field_0.m128[1];
  fVar109 = pre->ray_space[k].vy.field_0.m128[0];
  fVar110 = pre->ray_space[k].vy.field_0.m128[1];
  fVar136 = pre->ray_space[k].vz.field_0.m128[0];
  fVar137 = pre->ray_space[k].vz.field_0.m128[1];
  fVar213 = local_158 * fVar150 + fStack_154 * fVar109 + fStack_150 * fVar136;
  fVar214 = local_158 * fVar70 + fStack_154 * fVar110 + fStack_150 * fVar137;
  auVar90._4_4_ = fVar214;
  auVar90._0_4_ = fVar213;
  local_168 = fVar312 - local_1c8;
  fStack_164 = fVar310 - fStack_1c4;
  fStack_160 = fVar317 - fStack_1c0;
  fStack_15c = fVar321 - 0.0;
  fVar267 = local_168 * fVar150 + fStack_164 * fVar109 + fStack_160 * fVar136;
  fVar269 = local_168 * fVar70 + fStack_164 * fVar110 + fStack_160 * fVar137;
  auVar278._4_4_ = fVar269;
  auVar278._0_4_ = fVar267;
  local_178 = fVar254 - local_1c8;
  fStack_174 = fVar255 - fStack_1c4;
  fStack_170 = fVar307 - fStack_1c0;
  fStack_16c = fVar230 - 0.0;
  fVar323 = local_178 * fVar150 + fStack_174 * fVar109 + fStack_170 * fVar136;
  fVar288 = local_178 * fVar70 + fStack_174 * fVar110 + fStack_170 * fVar137;
  auVar123._4_4_ = fVar288;
  auVar123._0_4_ = fVar323;
  local_188 = fVar174 - local_1c8;
  fStack_184 = fVar177 - fStack_1c4;
  fStack_180 = fVar182 - fStack_1c0;
  fStack_17c = fVar208 - 0.0;
  fVar215 = local_188 * fVar150 + fStack_184 * fVar109 + fStack_180 * fVar136;
  fVar228 = local_188 * fVar70 + fStack_184 * fVar110 + fStack_180 * fVar137;
  auVar329._4_4_ = fVar228;
  auVar329._0_4_ = fVar215;
  local_198 = fVar138 - local_1c8;
  fStack_194 = fVar149 - fStack_1c4;
  fStack_190 = fVar151 - fStack_1c0;
  fStack_18c = fVar160 - 0.0;
  fVar229 = local_198 * fVar150 + fStack_194 * fVar109 + fStack_190 * fVar136;
  fVar241 = local_198 * fVar70 + fStack_194 * fVar110 + fStack_190 * fVar137;
  local_1a8 = fVar239 - local_1c8;
  fStack_1a4 = fVar283 - fStack_1c4;
  fStack_1a0 = fVar287 - fStack_1c0;
  fStack_19c = fVar319 - 0.0;
  fVar301 = local_1a8 * fVar150 + fStack_1a4 * fVar109 + fStack_1a0 * fVar136;
  fVar308 = local_1a8 * fVar70 + fStack_1a4 * fVar110 + fStack_1a0 * fVar137;
  auVar278._12_4_ = fVar308;
  auVar278._8_4_ = fVar301;
  local_1b8 = ((fVar240 - (fVar162 + fVar272) * 0.33333334) * fVar305 +
              (fVar209 - (fVar325 + fVar284) * 0.33333334) * fVar108) - local_1c8;
  fStack_1b4 = ((fVar256 - (fVar175 + fVar285) * 0.33333334) * fVar305 +
               (fVar210 - (fVar327 + fVar298) * 0.33333334) * fVar108) - fStack_1c4;
  fStack_1b0 = fVar159 - fStack_1c0;
  fStack_1ac = fVar161 - 0.0;
  fVar108 = local_1b8 * fVar150 + fStack_1b4 * fVar109 + fStack_1b0 * fVar136;
  fVar209 = local_1b8 * fVar70 + fStack_1b4 * fVar110 + fStack_1b0 * fVar137;
  local_1c8 = local_298 - local_1c8;
  fStack_1c4 = fStack_294 - fStack_1c4;
  fStack_1c0 = fStack_290 - fStack_1c0;
  fStack_1bc = fStack_28c - 0.0;
  fVar150 = local_1c8 * fVar150 + fStack_1c4 * fVar109 + fStack_1c0 * fVar136;
  fVar70 = local_1c8 * fVar70 + fStack_1c4 * fVar110 + fStack_1c0 * fVar137;
  auVar329._12_4_ = fVar70;
  auVar329._8_4_ = fVar150;
  auVar90._8_4_ = fVar229;
  auVar90._12_4_ = fVar241;
  auVar71 = minps(auVar90,auVar278);
  auVar123._8_4_ = fVar108;
  auVar123._12_4_ = fVar209;
  auVar140 = minps(auVar123,auVar329);
  auVar71 = minps(auVar71,auVar140);
  auVar124._4_4_ = fVar214;
  auVar124._0_4_ = fVar213;
  auVar124._8_4_ = fVar229;
  auVar124._12_4_ = fVar241;
  auVar140 = maxps(auVar124,auVar278);
  auVar141._4_4_ = fVar288;
  auVar141._0_4_ = fVar323;
  auVar141._8_4_ = fVar108;
  auVar141._12_4_ = fVar209;
  auVar142 = maxps(auVar141,auVar329);
  auVar246 = maxps(auVar140,auVar142);
  auVar22._4_8_ = auVar142._8_8_;
  auVar22._0_4_ = auVar71._4_4_;
  auVar143._0_8_ = auVar22._0_8_ << 0x20;
  auVar143._8_4_ = auVar71._8_4_;
  auVar143._12_4_ = auVar71._12_4_;
  auVar144._8_8_ = auVar71._8_8_;
  auVar144._0_8_ = auVar143._8_8_;
  auVar140 = minps(auVar71,auVar144);
  auVar23._4_8_ = auVar71._8_8_;
  auVar23._0_4_ = auVar246._4_4_;
  auVar145._0_8_ = auVar23._0_8_ << 0x20;
  auVar145._8_4_ = auVar246._8_4_;
  auVar145._12_4_ = auVar246._12_4_;
  auVar146._8_8_ = auVar246._8_8_;
  auVar146._0_8_ = auVar145._8_8_;
  auVar71 = maxps(auVar246,auVar146);
  auVar91._0_8_ = auVar140._0_8_ & 0x7fffffff7fffffff;
  auVar91._8_4_ = auVar140._8_4_ & 0x7fffffff;
  auVar91._12_4_ = auVar140._12_4_ & 0x7fffffff;
  auVar125._0_8_ = auVar71._0_8_ & 0x7fffffff7fffffff;
  auVar125._8_4_ = auVar71._8_4_ & 0x7fffffff;
  auVar125._12_4_ = auVar71._12_4_ & 0x7fffffff;
  auVar71 = maxps(auVar91,auVar125);
  fStack_114 = auVar71._4_4_;
  local_118 = fStack_114;
  if (fStack_114 <= auVar71._0_4_) {
    local_118 = auVar71._0_4_;
  }
  uVar56 = (ulong)uVar63 + 0xf;
  local_118 = local_118 * 9.536743e-07;
  fStack_110 = fStack_114;
  fStack_10c = fStack_114;
  local_268 = local_118;
  fStack_264 = local_118;
  fStack_260 = local_118;
  fStack_25c = local_118;
  local_278 = -local_118;
  fStack_274 = -local_118;
  fStack_270 = -local_118;
  fStack_26c = -local_118;
  local_128 = fVar267 - fVar213;
  fStack_124 = fVar269 - fVar214;
  fStack_120 = fVar301 - fVar229;
  fStack_11c = fVar308 - fVar241;
  local_138 = fVar323 - fVar267;
  fStack_134 = fVar288 - fVar269;
  fStack_130 = fVar108 - fVar301;
  fStack_12c = fVar209 - fVar308;
  local_148 = fVar215 - fVar323;
  fStack_144 = fVar228 - fVar288;
  fStack_140 = fVar150 - fVar108;
  fStack_13c = fVar70 - fVar209;
  local_2a8 = fVar138 - fVar268;
  fStack_2a4 = fVar149 - fVar270;
  fStack_2a0 = fVar151 - fVar271;
  fStack_29c = fVar160 - fVar286;
  local_2b8 = fVar239 - fVar312;
  fStack_2b4 = fVar283 - fVar310;
  fStack_2b0 = fVar287 - fVar317;
  fStack_2ac = fVar319 - fVar321;
  local_2c8 = fVar108 - fVar254;
  fStack_2c4 = fVar209 - fVar255;
  fStack_2c0 = fVar159 - fVar307;
  fStack_2bc = fVar161 - fVar230;
  local_2d8 = local_298 - fVar174;
  fStack_2d4 = fStack_294 - fVar177;
  fStack_2d0 = fStack_290 - fVar182;
  fStack_2cc = fStack_28c - fVar208;
  local_2f8 = uVar65;
  uStack_2f4 = uVar65;
  uStack_2f0 = uVar65;
  uStack_2ec = uVar65;
  local_308 = uVar67;
  uStack_304 = uVar67;
  uStack_300 = uVar67;
  uStack_2fc = uVar67;
  uVar61 = 0;
  fVar109 = *(float *)(local_4f8 + k * 4 + 0x30);
  fVar137 = 0.0;
  fVar160 = 1.0;
  fVar110 = 0.0;
  fVar136 = 1.0;
  ray = local_4f8;
  local_380 = uVar56;
LAB_00b54a54:
  do {
    fVar161 = 1.0 - fVar110;
    fVar208 = 1.0 - fVar110;
    fVar210 = 1.0 - fVar136;
    fVar230 = 1.0 - fVar136;
    fVar327 = fVar213 * fVar161 + fVar229 * fVar110;
    fVar181 = fVar214 * fVar208 + fVar241 * fVar110;
    fVar257 = fVar213 * fVar210 + fVar229 * fVar136;
    fVar309 = fVar214 * fVar230 + fVar241 * fVar136;
    fVar272 = fVar267 * fVar161 + fVar301 * fVar110;
    fVar163 = fVar269 * fVar208 + fVar308 * fVar110;
    fVar175 = fVar267 * fVar210 + fVar301 * fVar136;
    fVar176 = fVar269 * fVar230 + fVar308 * fVar136;
    fVar300 = fVar323 * fVar161 + fVar108 * fVar110;
    fVar303 = fVar288 * fVar208 + fVar209 * fVar110;
    fVar322 = fVar323 * fVar210 + fVar108 * fVar136;
    fVar324 = fVar288 * fVar230 + fVar209 * fVar136;
    fVar178 = fVar161 * fVar215 + fVar110 * fVar150;
    fVar179 = fVar208 * fVar228 + fVar110 * fVar70;
    fVar180 = fVar210 * fVar215 + fVar136 * fVar150;
    fVar286 = fVar230 * fVar228 + fVar136 * fVar70;
    fVar289 = (fVar160 - fVar137) * 0.11111111;
    fVar311 = (fVar160 - fVar137) * 0.0 + fVar137;
    fVar316 = (fVar160 - fVar137) * 0.33333334 + fVar137;
    fVar318 = (fVar160 - fVar137) * 0.6666667 + fVar137;
    fVar320 = (fVar160 - fVar137) * 1.0 + fVar137;
    fVar208 = 1.0 - fVar311;
    fVar230 = 1.0 - fVar316;
    fVar256 = 1.0 - fVar318;
    fVar284 = 1.0 - fVar320;
    fVar285 = fVar272 * fVar208 + fVar300 * fVar311;
    fVar298 = fVar272 * fVar230 + fVar300 * fVar316;
    fVar319 = fVar272 * fVar256 + fVar300 * fVar318;
    fVar299 = fVar272 * fVar284 + fVar300 * fVar320;
    fVar321 = fVar163 * fVar208 + fVar303 * fVar311;
    fVar302 = fVar163 * fVar230 + fVar303 * fVar316;
    fVar325 = fVar163 * fVar256 + fVar303 * fVar318;
    fVar305 = fVar163 * fVar284 + fVar303 * fVar320;
    fVar161 = (fVar327 * fVar208 + fVar272 * fVar311) * fVar208 + fVar311 * fVar285;
    fVar210 = (fVar327 * fVar230 + fVar272 * fVar316) * fVar230 + fVar316 * fVar298;
    fVar240 = (fVar327 * fVar256 + fVar272 * fVar318) * fVar256 + fVar318 * fVar319;
    fVar272 = (fVar327 * fVar284 + fVar272 * fVar320) * fVar284 + fVar320 * fVar299;
    fVar327 = (fVar181 * fVar208 + fVar163 * fVar311) * fVar208 + fVar311 * fVar321;
    fVar328 = (fVar181 * fVar230 + fVar163 * fVar316) * fVar230 + fVar316 * fVar302;
    fVar162 = (fVar181 * fVar256 + fVar163 * fVar318) * fVar256 + fVar318 * fVar325;
    fVar163 = (fVar181 * fVar284 + fVar163 * fVar320) * fVar284 + fVar320 * fVar305;
    fVar285 = fVar285 * fVar208 + (fVar300 * fVar208 + fVar178 * fVar311) * fVar311;
    fVar298 = fVar298 * fVar230 + (fVar300 * fVar230 + fVar178 * fVar316) * fVar316;
    fVar319 = fVar319 * fVar256 + (fVar300 * fVar256 + fVar178 * fVar318) * fVar318;
    fVar299 = fVar299 * fVar284 + (fVar300 * fVar284 + fVar178 * fVar320) * fVar320;
    fVar321 = fVar321 * fVar208 + (fVar303 * fVar208 + fVar179 * fVar311) * fVar311;
    fVar302 = fVar302 * fVar230 + (fVar303 * fVar230 + fVar179 * fVar316) * fVar316;
    fVar325 = fVar325 * fVar256 + (fVar303 * fVar256 + fVar179 * fVar318) * fVar318;
    fVar305 = fVar305 * fVar284 + (fVar303 * fVar284 + fVar179 * fVar320) * fVar320;
    local_348 = fVar208 * fVar161 + fVar311 * fVar285;
    fStack_344 = fVar230 * fVar210 + fVar316 * fVar298;
    fStack_340 = fVar256 * fVar240 + fVar318 * fVar319;
    fStack_33c = fVar284 * fVar272 + fVar320 * fVar299;
    local_258 = fVar208 * fVar327 + fVar311 * fVar321;
    fStack_254 = fVar230 * fVar328 + fVar316 * fVar302;
    fStack_250 = fVar256 * fVar162 + fVar318 * fVar325;
    fStack_24c = fVar284 * fVar163 + fVar320 * fVar305;
    fVar298 = (fVar298 - fVar210) * 3.0 * fVar289;
    fVar319 = (fVar319 - fVar240) * 3.0 * fVar289;
    fVar299 = (fVar299 - fVar272) * 3.0 * fVar289;
    fVar302 = (fVar302 - fVar328) * 3.0 * fVar289;
    fVar325 = (fVar325 - fVar162) * 3.0 * fVar289;
    fVar305 = (fVar305 - fVar163) * 3.0 * fVar289;
    local_1f8._4_4_ = fStack_340;
    local_1f8._0_4_ = fStack_344;
    local_1e8._4_4_ = fStack_250;
    local_1e8._0_4_ = fStack_254;
    local_328 = local_348 + (fVar285 - fVar161) * 3.0 * fVar289;
    fStack_324 = fStack_344 + fVar298;
    fStack_320 = fStack_340 + fVar319;
    fStack_31c = fStack_33c + fVar299;
    fVar161 = local_258 + (fVar321 - fVar327) * 3.0 * fVar289;
    fVar210 = fStack_254 + fVar302;
    fVar240 = fStack_250 + fVar325;
    fVar272 = fStack_24c + fVar305;
    local_1f8._8_4_ = fStack_33c;
    local_1f8._12_4_ = 0;
    local_338._0_4_ = fStack_344 - fVar298;
    local_338._4_4_ = fStack_340 - fVar319;
    local_338._8_4_ = fStack_33c - fVar299;
    local_338._12_4_ = 0;
    auVar92._0_4_ = fStack_254 - fVar302;
    auVar92._4_4_ = fStack_250 - fVar325;
    auVar92._8_4_ = fStack_24c - fVar305;
    auVar92._12_4_ = 0;
    fVar285 = fVar175 * fVar208 + fVar322 * fVar311;
    fVar298 = fVar175 * fVar230 + fVar322 * fVar316;
    fVar319 = fVar175 * fVar256 + fVar322 * fVar318;
    fVar299 = fVar175 * fVar284 + fVar322 * fVar320;
    fVar321 = fVar176 * fVar208 + fVar324 * fVar311;
    fVar302 = fVar176 * fVar230 + fVar324 * fVar316;
    fVar325 = fVar176 * fVar256 + fVar324 * fVar318;
    fVar305 = fVar176 * fVar284 + fVar324 * fVar320;
    fVar327 = (fVar257 * fVar208 + fVar175 * fVar311) * fVar208 + fVar311 * fVar285;
    fVar328 = (fVar257 * fVar230 + fVar175 * fVar316) * fVar230 + fVar316 * fVar298;
    fVar162 = (fVar257 * fVar256 + fVar175 * fVar318) * fVar256 + fVar318 * fVar319;
    fVar163 = (fVar257 * fVar284 + fVar175 * fVar320) * fVar284 + fVar320 * fVar299;
    fVar300 = (fVar309 * fVar208 + fVar176 * fVar311) * fVar208 + fVar311 * fVar321;
    fVar303 = (fVar309 * fVar230 + fVar176 * fVar316) * fVar230 + fVar316 * fVar302;
    fVar306 = (fVar309 * fVar256 + fVar176 * fVar318) * fVar256 + fVar318 * fVar325;
    fVar309 = (fVar309 * fVar284 + fVar176 * fVar320) * fVar284 + fVar320 * fVar305;
    fVar175 = fVar285 * fVar208 + (fVar322 * fVar208 + fVar180 * fVar311) * fVar311;
    fVar176 = fVar298 * fVar230 + (fVar322 * fVar230 + fVar180 * fVar316) * fVar316;
    fVar178 = fVar319 * fVar256 + (fVar322 * fVar256 + fVar180 * fVar318) * fVar318;
    fVar179 = fVar299 * fVar284 + (fVar322 * fVar284 + fVar180 * fVar320) * fVar320;
    fVar180 = fVar321 * fVar208 + (fVar324 * fVar208 + fVar286 * fVar311) * fVar311;
    fVar181 = fVar302 * fVar230 + (fVar324 * fVar230 + fVar286 * fVar316) * fVar316;
    fVar257 = fVar325 * fVar256 + (fVar324 * fVar256 + fVar286 * fVar318) * fVar318;
    fVar286 = fVar305 * fVar284 + (fVar324 * fVar284 + fVar286 * fVar320) * fVar320;
    fVar321 = fVar208 * fVar327 + fVar311 * fVar175;
    fVar302 = fVar230 * fVar328 + fVar316 * fVar176;
    fVar325 = fVar256 * fVar162 + fVar318 * fVar178;
    fVar305 = fVar284 * fVar163 + fVar320 * fVar179;
    fVar285 = fVar208 * fVar300 + fVar311 * fVar180;
    fVar298 = fVar230 * fVar303 + fVar316 * fVar181;
    fVar319 = fVar256 * fVar306 + fVar318 * fVar257;
    fVar299 = fVar284 * fVar309 + fVar320 * fVar286;
    fVar208 = (fVar176 - fVar328) * 3.0 * fVar289;
    fVar230 = (fVar178 - fVar162) * 3.0 * fVar289;
    fVar256 = (fVar179 - fVar163) * 3.0 * fVar289;
    fVar284 = (fVar181 - fVar303) * 3.0 * fVar289;
    fVar328 = (fVar257 - fVar306) * 3.0 * fVar289;
    fVar162 = (fVar286 - fVar309) * 3.0 * fVar289;
    local_208._4_4_ = fVar325;
    local_208._0_4_ = fVar302;
    local_208._8_4_ = fVar305;
    local_208._12_4_ = 0;
    local_228._4_4_ = fVar319;
    local_228._0_4_ = fVar298;
    local_228._8_4_ = fVar299;
    local_228._12_4_ = 0;
    local_248 = fVar321 + (fVar175 - fVar327) * 3.0 * fVar289;
    fStack_244 = fVar302 + fVar208;
    fStack_240 = fVar325 + fVar230;
    fStack_23c = fVar305 + fVar256;
    local_218 = fVar285 + (fVar180 - fVar300) * 3.0 * fVar289;
    fStack_214 = fVar298 + fVar284;
    fStack_210 = fVar319 + fVar328;
    fStack_20c = fVar299 + fVar162;
    local_1d8._0_4_ = fVar302 - fVar208;
    local_1d8._4_4_ = fVar325 - fVar230;
    local_1d8._8_4_ = fVar305 - fVar256;
    local_1d8._12_4_ = 0;
    local_238._0_4_ = fVar298 - fVar284;
    local_238._4_4_ = fVar319 - fVar328;
    local_238._8_4_ = fVar299 - fVar162;
    local_238._12_4_ = 0;
    fVar208 = (fVar302 - fStack_344) + (fVar321 - local_348);
    fVar230 = (fVar325 - fStack_340) + (fVar302 - fStack_344);
    fVar256 = (fVar305 - fStack_33c) + (fVar325 - fStack_340);
    fVar284 = (fVar305 - fStack_33c) + 0.0;
    local_1e8._8_4_ = fStack_24c;
    local_1e8._12_4_ = 0;
    fVar327 = (fVar298 - fStack_254) + (fVar285 - local_258);
    fVar328 = (fVar319 - fStack_250) + (fVar298 - fStack_254);
    fVar162 = (fVar299 - fStack_24c) + (fVar319 - fStack_250);
    fVar163 = (fVar299 - fStack_24c) + 0.0;
    auVar221._0_8_ =
         CONCAT44(fStack_254 * fVar230 - fStack_344 * fVar328,
                  local_258 * fVar208 - local_348 * fVar327);
    auVar221._8_4_ = fStack_250 * fVar256 - fStack_340 * fVar162;
    auVar221._12_4_ = fStack_24c * fVar284 - fStack_33c * fVar163;
    auVar164._0_4_ = fVar161 * fVar208 - local_328 * fVar327;
    auVar164._4_4_ = fVar210 * fVar230 - fStack_324 * fVar328;
    auVar164._8_4_ = fVar240 * fVar256 - fStack_320 * fVar162;
    auVar164._12_4_ = fVar272 * fVar284 - fStack_31c * fVar163;
    auVar199._0_8_ =
         CONCAT44(auVar92._4_4_ * fVar230 - fVar328 * local_338._4_4_,
                  auVar92._0_4_ * fVar208 - fVar327 * local_338._0_4_);
    auVar199._8_4_ = auVar92._8_4_ * fVar256 - fVar162 * local_338._8_4_;
    auVar199._12_4_ = fVar284 * 0.0 - fVar163 * 0.0;
    auVar295._0_4_ = fVar208 * fStack_254 - fVar327 * fStack_344;
    auVar295._4_4_ = fVar230 * fStack_250 - fVar328 * fStack_340;
    auVar295._8_4_ = fVar256 * fStack_24c - fVar162 * fStack_33c;
    auVar295._12_4_ = fVar284 * 0.0 - fVar163 * 0.0;
    auVar247._0_8_ =
         CONCAT44(fVar298 * fVar230 - fVar302 * fVar328,fVar285 * fVar208 - fVar321 * fVar327);
    auVar247._8_4_ = fVar319 * fVar256 - fVar325 * fVar162;
    auVar247._12_4_ = fVar299 * fVar284 - fVar305 * fVar163;
    auVar313._0_4_ = local_218 * fVar208 - local_248 * fVar327;
    auVar313._4_4_ = fStack_214 * fVar230 - fStack_244 * fVar328;
    auVar313._8_4_ = fStack_210 * fVar256 - fStack_240 * fVar162;
    auVar313._12_4_ = fStack_20c * fVar284 - fStack_23c * fVar163;
    auVar231._0_8_ =
         CONCAT44(local_238._4_4_ * fVar230 - fVar328 * local_1d8._4_4_,
                  local_238._0_4_ * fVar208 - fVar327 * local_1d8._0_4_);
    auVar231._8_4_ = local_238._8_4_ * fVar256 - fVar162 * local_1d8._8_4_;
    auVar231._12_4_ = fVar284 * 0.0 - fVar163 * 0.0;
    auVar93._0_4_ = fVar208 * fVar298 - fVar327 * fVar302;
    auVar93._4_4_ = fVar230 * fVar319 - fVar328 * fVar325;
    auVar93._8_4_ = fVar256 * fVar299 - fVar162 * fVar305;
    auVar93._12_4_ = fVar284 * 0.0 - fVar163 * 0.0;
    auVar126._8_4_ = auVar221._8_4_;
    auVar126._0_8_ = auVar221._0_8_;
    auVar126._12_4_ = auVar221._12_4_;
    auVar71 = minps(auVar126,auVar164);
    auVar246 = maxps(auVar221,auVar164);
    auVar165._8_4_ = auVar199._8_4_;
    auVar165._0_8_ = auVar199._0_8_;
    auVar165._12_4_ = auVar199._12_4_;
    auVar140 = minps(auVar165,auVar295);
    auVar71 = minps(auVar71,auVar140);
    auVar140 = maxps(auVar199,auVar295);
    auVar142 = maxps(auVar246,auVar140);
    auVar166._8_4_ = auVar247._8_4_;
    auVar166._0_8_ = auVar247._0_8_;
    auVar166._12_4_ = auVar247._12_4_;
    auVar140 = minps(auVar166,auVar313);
    auVar248 = maxps(auVar247,auVar313);
    auVar200._8_4_ = auVar231._8_4_;
    auVar200._0_8_ = auVar231._0_8_;
    auVar200._12_4_ = auVar231._12_4_;
    auVar246 = minps(auVar200,auVar93);
    auVar140 = minps(auVar140,auVar246);
    auVar71 = minps(auVar71,auVar140);
    auVar140 = maxps(auVar231,auVar93);
    auVar140 = maxps(auVar248,auVar140);
    auVar140 = maxps(auVar142,auVar140);
    auVar222._0_4_ =
         -(uint)(local_278 <= auVar140._0_4_ && auVar71._0_4_ <= local_268) & local_288._0_4_;
    auVar222._4_4_ =
         -(uint)(fStack_274 <= auVar140._4_4_ && auVar71._4_4_ <= fStack_264) & local_288._4_4_;
    auVar222._8_4_ =
         -(uint)(fStack_270 <= auVar140._8_4_ && auVar71._8_4_ <= fStack_260) & local_288._8_4_;
    auVar222._12_4_ =
         -(uint)(fStack_26c <= auVar140._12_4_ && auVar71._12_4_ <= fStack_25c) & local_288._12_4_;
    uVar68 = movmskps((int)uVar56,auVar222);
    uVar56 = (ulong)uVar68;
    if (uVar68 != 0) {
      fVar208 = (fVar302 - fVar321) + (fStack_344 - local_348);
      fVar230 = (fVar325 - fVar302) + (fStack_340 - fStack_344);
      fVar256 = (fVar305 - fVar325) + (fStack_33c - fStack_340);
      fVar284 = (0.0 - fVar305) + (0.0 - fStack_33c);
      fVar327 = (fVar298 - fVar285) + (fStack_254 - local_258);
      fVar328 = (fVar319 - fVar298) + (fStack_250 - fStack_254);
      fVar162 = (fVar299 - fVar319) + (fStack_24c - fStack_250);
      fVar163 = (0.0 - fVar299) + (0.0 - fStack_24c);
      auVar330._0_8_ =
           CONCAT44(fStack_254 * fVar230 - fStack_344 * fVar328,
                    local_258 * fVar208 - local_348 * fVar327);
      auVar330._8_4_ = fStack_250 * fVar256 - fStack_340 * fVar162;
      auVar330._12_4_ = fStack_24c * fVar284 - fStack_33c * fVar163;
      auVar167._0_4_ = fVar161 * fVar208 - local_328 * fVar327;
      auVar167._4_4_ = fVar210 * fVar230 - fStack_324 * fVar328;
      auVar167._8_4_ = fVar240 * fVar256 - fStack_320 * fVar162;
      auVar167._12_4_ = fVar272 * fVar284 - fStack_31c * fVar163;
      auVar232._0_8_ =
           CONCAT44(auVar92._4_4_ * fVar230 - local_338._4_4_ * fVar328,
                    auVar92._0_4_ * fVar208 - local_338._0_4_ * fVar327);
      auVar232._8_4_ = auVar92._8_4_ * fVar256 - local_338._8_4_ * fVar162;
      auVar232._12_4_ = fVar284 * 0.0 - fVar163 * 0.0;
      auVar201._0_4_ = fStack_254 * fVar208 - fStack_344 * fVar327;
      auVar201._4_4_ = fStack_250 * fVar230 - fStack_340 * fVar328;
      auVar201._8_4_ = fStack_24c * fVar256 - fStack_33c * fVar162;
      auVar201._12_4_ = fVar284 * 0.0 - fVar163 * 0.0;
      auVar147._0_8_ =
           CONCAT44(fVar298 * fVar230 - fVar302 * fVar328,fVar285 * fVar208 - fVar321 * fVar327);
      auVar147._8_4_ = fVar319 * fVar256 - fVar325 * fVar162;
      auVar147._12_4_ = fVar299 * fVar284 - fVar305 * fVar163;
      auVar262._0_4_ = local_218 * fVar208 - local_248 * fVar327;
      auVar262._4_4_ = fStack_214 * fVar230 - fStack_244 * fVar328;
      auVar262._8_4_ = fStack_210 * fVar256 - fStack_240 * fVar162;
      auVar262._12_4_ = fStack_20c * fVar284 - fStack_23c * fVar163;
      auVar296._0_8_ =
           CONCAT44(local_238._4_4_ * fVar230 - local_1d8._4_4_ * fVar328,
                    local_238._0_4_ * fVar208 - local_1d8._0_4_ * fVar327);
      auVar296._8_4_ = local_238._8_4_ * fVar256 - local_1d8._8_4_ * fVar162;
      auVar296._12_4_ = fVar284 * 0.0 - fVar163 * 0.0;
      auVar94._0_4_ = fVar208 * fVar298 - fVar327 * fVar302;
      auVar94._4_4_ = fVar230 * fVar319 - fVar328 * fVar325;
      auVar94._8_4_ = fVar256 * fVar299 - fVar162 * fVar305;
      auVar94._12_4_ = fVar284 * 0.0 - fVar163 * 0.0;
      auVar127._8_4_ = auVar330._8_4_;
      auVar127._0_8_ = auVar330._0_8_;
      auVar127._12_4_ = auVar330._12_4_;
      auVar71 = minps(auVar127,auVar167);
      auVar246 = maxps(auVar330,auVar167);
      auVar168._8_4_ = auVar232._8_4_;
      auVar168._0_8_ = auVar232._0_8_;
      auVar168._12_4_ = auVar232._12_4_;
      auVar140 = minps(auVar168,auVar201);
      auVar71 = minps(auVar71,auVar140);
      auVar140 = maxps(auVar232,auVar201);
      auVar248 = maxps(auVar246,auVar140);
      auVar169._8_4_ = auVar147._8_4_;
      auVar169._0_8_ = auVar147._0_8_;
      auVar169._12_4_ = auVar147._12_4_;
      auVar246 = minps(auVar169,auVar262);
      auVar140 = maxps(auVar147,auVar262);
      auVar202._8_4_ = auVar296._8_4_;
      auVar202._0_8_ = auVar296._0_8_;
      auVar202._12_4_ = auVar296._12_4_;
      auVar142 = minps(auVar202,auVar94);
      auVar246 = minps(auVar246,auVar142);
      auVar71 = minps(auVar71,auVar246);
      auVar246 = maxps(auVar296,auVar94);
      auVar140 = maxps(auVar140,auVar246);
      auVar140 = maxps(auVar248,auVar140);
      auVar331._0_4_ =
           -(uint)(local_278 <= auVar140._0_4_ && auVar71._0_4_ <= local_268) & auVar222._0_4_;
      auVar331._4_4_ =
           -(uint)(fStack_274 <= auVar140._4_4_ && auVar71._4_4_ <= fStack_264) & auVar222._4_4_;
      auVar331._8_4_ =
           -(uint)(fStack_270 <= auVar140._8_4_ && auVar71._8_4_ <= fStack_260) & auVar222._8_4_;
      auVar331._12_4_ =
           -(uint)(fStack_26c <= auVar140._12_4_ && auVar71._12_4_ <= fStack_25c) & auVar222._12_4_;
      uVar68 = movmskps(uVar68,auVar331);
      uVar56 = (ulong)uVar68;
      if (uVar68 != 0) {
        uVar56 = (ulong)(byte)uVar68;
        auStack_318[uVar61] = uVar68 & 0xff;
        *(ulong *)(afStack_108 + uVar61 * 2) = CONCAT44(fVar160,fVar137);
        *(ulong *)(afStack_58 + uVar61 * 2) = CONCAT44(fVar136,fVar110);
        uVar61 = (ulong)((int)uVar61 + 1);
      }
    }
LAB_00b550cf:
    _local_508 = auVar92;
    auVar71 = _local_508;
    if ((int)uVar61 == 0) {
      fVar150 = *(float *)(ray + k * 4 + 0x80);
      auVar135._4_4_ = -(uint)(fStack_2e4 <= fVar150);
      auVar135._0_4_ = -(uint)(local_2e8 <= fVar150);
      auVar135._8_4_ = -(uint)(fStack_2e0 <= fVar150);
      auVar135._12_4_ = -(uint)(fStack_2dc <= fVar150);
      uVar65 = movmskps((int)uVar56,auVar135);
      uVar63 = uVar63 & (uint)local_380 & uVar65;
      if (uVar63 == 0) {
        return;
      }
      goto LAB_00b53c13;
    }
    uVar54 = (int)uVar61 - 1;
    uVar56 = (ulong)uVar54;
    uVar68 = auStack_318[uVar56];
    fVar110 = afStack_58[uVar56 * 2];
    fVar136 = afStack_58[uVar56 * 2 + 1];
    uVar6 = 0;
    if (uVar68 != 0) {
      for (; (uVar68 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
      }
    }
    uVar68 = uVar68 - 1 & uVar68;
    auStack_318[uVar56] = uVar68;
    if (uVar68 == 0) {
      uVar61 = (ulong)uVar54;
    }
    fVar160 = (float)(uVar6 + 1) * 0.33333334;
    fVar161 = afStack_108[uVar56 * 2];
    fVar208 = afStack_108[uVar56 * 2 + 1];
    fVar137 = fVar161 * (1.0 - (float)uVar6 * 0.33333334) + fVar208 * (float)uVar6 * 0.33333334;
    fVar160 = fVar161 * (1.0 - fVar160) + fVar208 * fVar160;
    fVar210 = fVar161 * 0.0 + fVar208 * 0.0;
    fVar208 = fVar161 * 0.0 + fVar208 * 0.0;
    fVar161 = fVar160 - fVar137;
    if (fVar161 < 0.16666667) {
      fVar285 = 1.0 - fVar110;
      fVar319 = 1.0 - fVar110;
      fVar302 = 1.0 - fVar136;
      fVar325 = 1.0 - fVar136;
      fVar284 = fVar213 * fVar285 + fVar229 * fVar110;
      fVar298 = fVar214 * fVar319 + fVar241 * fVar110;
      fVar299 = fVar213 * fVar302 + fVar229 * fVar136;
      fVar321 = fVar214 * fVar325 + fVar241 * fVar136;
      fVar230 = fVar267 * fVar285 + fVar301 * fVar110;
      fVar240 = fVar269 * fVar319 + fVar308 * fVar110;
      fVar256 = fVar267 * fVar302 + fVar301 * fVar136;
      fVar272 = fVar269 * fVar325 + fVar308 * fVar136;
      fVar179 = fVar323 * fVar285 + fVar108 * fVar110;
      fVar181 = fVar288 * fVar319 + fVar209 * fVar110;
      fVar286 = fVar323 * fVar302 + fVar108 * fVar136;
      fVar300 = fVar288 * fVar325 + fVar209 * fVar136;
      fVar163 = (fVar285 * fVar215 + fVar110 * fVar150) - fVar179;
      fVar175 = (fVar319 * fVar228 + fVar110 * fVar70) - fVar181;
      fVar176 = (fVar302 * fVar215 + fVar136 * fVar150) - fVar286;
      fVar178 = (fVar325 * fVar228 + fVar136 * fVar70) - fVar300;
      fVar285 = fVar137 * (fVar179 - fVar230) + fVar230;
      fVar319 = fVar137 * (fVar181 - fVar240) + fVar240;
      fVar302 = fVar137 * (fVar286 - fVar256) + fVar256;
      fVar325 = fVar137 * (fVar300 - fVar272) + fVar272;
      fVar180 = (fVar179 - fVar230) * fVar160 + fVar230;
      fVar257 = (fVar181 - fVar240) * fVar160 + fVar240;
      fVar289 = (fVar286 - fVar256) * fVar160 + fVar256;
      fVar303 = (fVar300 - fVar272) * fVar160 + fVar272;
      fVar305 = fVar137 * (fVar230 - fVar284) + fVar284;
      fVar327 = fVar137 * (fVar240 - fVar298) + fVar298;
      fVar328 = fVar137 * (fVar256 - fVar299) + fVar299;
      fVar162 = fVar137 * (fVar272 - fVar321) + fVar321;
      fVar305 = (fVar285 - fVar305) * fVar137 + fVar305;
      fVar327 = (fVar319 - fVar327) * fVar137 + fVar327;
      fVar328 = (fVar302 - fVar328) * fVar137 + fVar328;
      fVar162 = (fVar325 - fVar162) * fVar137 + fVar162;
      fVar285 = (((fVar137 * fVar163 + fVar179) - fVar285) * fVar137 + fVar285) - fVar305;
      fVar319 = (((fVar137 * fVar175 + fVar181) - fVar319) * fVar137 + fVar319) - fVar327;
      fVar302 = (((fVar137 * fVar176 + fVar286) - fVar302) * fVar137 + fVar302) - fVar328;
      fVar325 = (((fVar137 * fVar178 + fVar300) - fVar325) * fVar137 + fVar325) - fVar162;
      fVar305 = fVar137 * fVar285 + fVar305;
      fVar327 = fVar137 * fVar319 + fVar327;
      fVar328 = fVar137 * fVar302 + fVar328;
      fVar162 = fVar137 * fVar325 + fVar162;
      fVar284 = (fVar230 - fVar284) * fVar160 + fVar284;
      fVar298 = (fVar240 - fVar298) * fVar160 + fVar298;
      fVar299 = (fVar256 - fVar299) * fVar160 + fVar299;
      fVar321 = (fVar272 - fVar321) * fVar160 + fVar321;
      fVar284 = (fVar180 - fVar284) * fVar160 + fVar284;
      fVar298 = (fVar257 - fVar298) * fVar160 + fVar298;
      fVar299 = (fVar289 - fVar299) * fVar160 + fVar299;
      fVar321 = (fVar303 - fVar321) * fVar160 + fVar321;
      fVar240 = (((fVar163 * fVar160 + fVar179) - fVar180) * fVar160 + fVar180) - fVar284;
      fVar256 = (((fVar175 * fVar160 + fVar181) - fVar257) * fVar160 + fVar257) - fVar298;
      fVar272 = (((fVar176 * fVar160 + fVar286) - fVar289) * fVar160 + fVar289) - fVar299;
      fVar257 = (((fVar178 * fVar160 + fVar300) - fVar303) * fVar160 + fVar303) - fVar321;
      fVar284 = fVar160 * fVar240 + fVar284;
      fVar298 = fVar160 * fVar256 + fVar298;
      fVar299 = fVar160 * fVar272 + fVar299;
      fVar321 = fVar160 * fVar257 + fVar321;
      fVar230 = fVar161 * 0.33333334;
      fVar163 = fVar285 * (float)DAT_01f7ff50 * fVar230 + fVar305;
      fVar175 = fVar319 * DAT_01f7ff50._4_4_ * fVar230 + fVar327;
      fVar176 = fVar302 * DAT_01f7ff50._8_4_ * fVar230 + fVar328;
      fVar178 = fVar325 * DAT_01f7ff50._12_4_ * fVar230 + fVar162;
      fVar179 = fVar284 - fVar230 * fVar240 * (float)DAT_01f7ff50;
      fVar180 = fVar298 - fVar230 * fVar256 * DAT_01f7ff50._4_4_;
      fVar181 = fVar299 - fVar230 * fVar272 * DAT_01f7ff50._8_4_;
      fVar257 = fVar321 - fVar230 * fVar257 * DAT_01f7ff50._12_4_;
      auVar24._4_8_ = DAT_01f7ff50._8_8_;
      auVar24._0_4_ = fVar298;
      auVar233._0_8_ = auVar24._0_8_ << 0x20;
      auVar233._8_4_ = fVar299;
      auVar233._12_4_ = fVar321;
      fVar285 = (fVar299 - fVar284) + (fVar328 - fVar305);
      fVar319 = (fVar321 - fVar298) + (fVar162 - fVar327);
      auVar249._0_4_ = fVar180 * fVar319;
      auVar249._4_4_ = fVar180 * fVar319;
      auVar249._8_4_ = fVar257 * fVar319;
      auVar249._12_4_ = fVar257 * fVar319;
      fVar230 = fVar305 * fVar285 + fVar327 * fVar319;
      fVar240 = fVar328 * fVar285 + fVar162 * fVar319;
      fVar302 = fVar163 * fVar285 + fVar175 * fVar319;
      fVar325 = fVar176 * fVar285 + fVar178 * fVar319;
      fVar286 = fVar179 * fVar285 + auVar249._0_4_;
      auVar223._0_8_ = CONCAT44(fVar180 * fVar285 + auVar249._4_4_,fVar286);
      auVar223._8_4_ = fVar181 * fVar285 + auVar249._8_4_;
      auVar223._12_4_ = fVar257 * fVar285 + auVar249._12_4_;
      fVar272 = fVar285 * fVar284 + fVar319 * fVar298;
      fVar289 = fVar285 * fVar299 + fVar319 * fVar321;
      auVar25._4_8_ = auVar249._8_8_;
      auVar25._0_4_ = fVar175 * fVar285 + fVar175 * fVar319;
      auVar250._0_8_ = auVar25._0_8_ << 0x20;
      auVar250._8_4_ = fVar325;
      auVar250._12_4_ = fVar178 * fVar285 + fVar178 * fVar319;
      fVar256 = fVar302;
      if (fVar302 <= fVar230) {
        fVar256 = fVar230;
        fVar230 = fVar302;
      }
      auVar251._8_8_ = auVar250._8_8_;
      auVar251._0_8_ = auVar251._8_8_;
      auVar95._8_4_ = auVar223._8_4_;
      auVar95._0_8_ = auVar223._0_8_;
      auVar95._12_4_ = auVar223._12_4_;
      if (fVar272 <= fVar286) {
        auVar95._0_4_ = fVar272;
      }
      if (auVar95._0_4_ <= fVar230) {
        fVar230 = auVar95._0_4_;
      }
      auVar26._4_8_ = auVar95._8_8_;
      auVar26._0_4_ = fVar285 * fVar298 + fVar319 * fVar298;
      auVar96._0_8_ = auVar26._0_8_ << 0x20;
      auVar96._8_4_ = fVar289;
      auVar96._12_4_ = fVar285 * fVar321 + fVar319 * fVar321;
      if (fVar272 <= fVar286) {
        fVar272 = fVar286;
      }
      auVar97._8_8_ = auVar96._8_8_;
      auVar97._0_8_ = auVar97._8_8_;
      if (fVar272 <= fVar256) {
        fVar272 = fVar256;
      }
      if (fVar325 <= fVar240) {
        auVar251._0_4_ = fVar240;
        fVar240 = fVar325;
      }
      auVar128._8_4_ = auVar223._8_4_;
      auVar128._0_8_ = auVar223._8_8_;
      auVar128._12_4_ = auVar223._12_4_;
      if (fVar289 <= auVar223._8_4_) {
        auVar128._0_4_ = fVar289;
      }
      if (auVar128._0_4_ <= fVar240) {
        fVar240 = auVar128._0_4_;
      }
      if (fVar289 <= auVar223._8_4_) {
        auVar97._0_4_ = auVar223._8_4_;
      }
      if (auVar97._0_4_ <= auVar251._0_4_) {
        auVar97._0_4_ = auVar251._0_4_;
      }
      bVar62 = 3 < (uint)uVar61;
      uVar27 = (undefined3)(uVar54 >> 8);
      uVar56 = (ulong)CONCAT31(uVar27,bVar62);
      fVar256 = auVar97._0_4_;
      if ((0.0001 <= fVar230) || (fVar256 <= -0.0001)) break;
      goto LAB_00b5543a;
    }
  } while( true );
  if ((fVar240 < 0.0001 && -0.0001 < fVar272) ||
     ((fVar230 < 0.0001 && -0.0001 < fVar272 ||
      (auVar92 = _local_508, fVar240 < 0.0001 && -0.0001 < fVar256)))) {
LAB_00b5543a:
    local_508 = (undefined1  [8])auVar233._8_8_;
    auVar92 = _local_508;
    local_4f8 = (RayHitK<4> *)CONCAT44(fVar321,fVar299);
    bVar62 = bVar62 || fVar161 < 0.001;
    uVar56 = (ulong)CONCAT31(uVar27,bVar62);
    fVar319 = (float)(~-(uint)(fVar230 < 0.0) & 0x3f800000 | -(uint)(fVar230 < 0.0) & 0xbf800000);
    fVar302 = (float)(~-(uint)(fVar272 < 0.0) & 0x3f800000 | -(uint)(fVar272 < 0.0) & 0xbf800000);
    fVar285 = 0.0;
    if ((fVar319 == fVar302) && (!NAN(fVar319) && !NAN(fVar302))) {
      fVar285 = INFINITY;
    }
    fVar325 = 0.0;
    if ((fVar319 == fVar302) && (!NAN(fVar319) && !NAN(fVar302))) {
      fVar325 = -INFINITY;
    }
    fVar286 = (float)(~-(uint)(fVar240 < 0.0) & 0x3f800000 | -(uint)(fVar240 < 0.0) & 0xbf800000);
    if ((fVar319 != fVar286) || (fVar289 = fVar325, NAN(fVar319) || NAN(fVar286))) {
      if ((fVar240 != fVar230) || (NAN(fVar240) || NAN(fVar230))) {
        fVar240 = -fVar230 / (fVar240 - fVar230);
        fVar240 = (1.0 - fVar240) * 0.0 + fVar240;
        fVar289 = fVar240;
      }
      else {
        fVar240 = 0.0;
        if ((fVar230 != 0.0) || (fVar289 = 1.0, NAN(fVar230))) {
          fVar240 = INFINITY;
          fVar289 = -INFINITY;
        }
      }
      if (fVar240 <= fVar285) {
        fVar285 = fVar240;
      }
      if (fVar289 <= fVar325) {
        fVar289 = fVar325;
      }
    }
    fVar230 = *(float *)(&DAT_01f80eb4 + (ulong)(fVar256 < 0.0) * 4);
    if ((fVar302 != fVar230) || (fVar240 = fVar289, NAN(fVar302) || NAN(fVar230))) {
      if ((fVar256 != fVar272) || (NAN(fVar256) || NAN(fVar272))) {
        fVar319 = -fVar272 / (fVar256 - fVar272);
        fVar319 = (1.0 - fVar319) * 0.0 + fVar319;
        fVar240 = fVar319;
      }
      else {
        fVar319 = 0.0;
        if ((fVar272 != 0.0) || (fVar240 = 1.0, NAN(fVar272))) {
          fVar319 = INFINITY;
          fVar240 = -INFINITY;
        }
      }
      if (fVar319 <= fVar285) {
        fVar285 = fVar319;
      }
      if (fVar240 <= fVar289) {
        fVar240 = fVar289;
      }
    }
    if ((fVar286 != fVar230) || (NAN(fVar286) || NAN(fVar230))) {
      fVar285 = (float)(~-(uint)(fVar285 < 1.0) & 0x3f800000 |
                       (uint)fVar285 & -(uint)(fVar285 < 1.0));
      fVar240 = (float)(~-(uint)(fVar240 < 1.0) & (uint)fVar240 |
                       -(uint)(fVar240 < 1.0) & 0x3f800000);
    }
    fVar285 = (float)(~-(uint)(fVar285 < 0.0) & (uint)fVar285);
    fVar230 = (float)(~-(uint)(fVar240 < 1.0) & 0x3f800000 | (uint)fVar240 & -(uint)(fVar240 < 1.0))
    ;
    fStack_500 = auVar71._8_4_;
    fStack_4fc = auVar71._12_4_;
    if (fVar285 <= fVar230) {
      fVar285 = fVar285 + -0.1;
      fVar230 = fVar230 + 0.1;
      uVar68 = -(uint)(fVar230 < 1.0);
      fVar285 = (float)(~-(uint)(fVar285 < 0.0) & (uint)fVar285);
      fVar230 = (float)(~uVar68 & 0x3f800000 | (uint)fVar230 & uVar68);
      fVar286 = 1.0 - fVar285;
      fVar289 = 1.0 - fVar285;
      fVar300 = 1.0 - fVar230;
      fVar303 = 1.0 - fVar230;
      fVar240 = fVar305 * fVar286 + fVar328 * fVar285;
      fVar272 = fVar327 * fVar289 + fVar162 * fVar285;
      fVar319 = fVar305 * fVar300 + fVar328 * fVar230;
      fVar302 = fVar327 * fVar303 + fVar162 * fVar230;
      fVar325 = fVar163 * fVar286 + fVar176 * fVar285;
      fVar305 = fVar175 * fVar289 + fVar178 * fVar285;
      fVar327 = fVar163 * fVar300 + fVar176 * fVar230;
      fVar328 = fVar175 * fVar303 + fVar178 * fVar230;
      fVar162 = fVar179 * fVar286 + fVar181 * fVar285;
      fVar163 = fVar180 * fVar289 + fVar257 * fVar285;
      fVar175 = fVar179 * fVar300 + fVar181 * fVar230;
      fVar176 = fVar180 * fVar303 + fVar257 * fVar230;
      fVar299 = fVar286 * fVar284 + fVar299 * fVar285;
      fVar321 = fVar289 * fVar298 + fVar321 * fVar285;
      fVar284 = fVar300 * fVar284 + fStack_500 * fVar230;
      fVar298 = fVar303 * fVar298 + fStack_4fc * fVar230;
      fVar178 = fVar110 * (1.0 - fVar230);
      fVar110 = fVar110 * (1.0 - fVar285) + fVar136 * fVar285;
      fVar136 = fVar178 + fVar136 * fVar230;
      fVar161 = 1.0 / fVar161;
      auVar129._0_4_ = fVar284 - fVar299;
      auVar129._4_4_ = fVar298 - fVar321;
      auVar129._8_4_ = fVar284 - fVar284;
      auVar129._12_4_ = fVar298 - fVar298;
      auVar157._0_8_ = CONCAT44(fVar176 - fVar163,fVar175 - fVar162);
      auVar157._8_4_ = fVar175 - fVar175;
      auVar157._12_4_ = fVar176 - fVar176;
      auVar203._0_4_ = fVar327 - fVar325;
      auVar203._4_4_ = fVar328 - fVar305;
      auVar203._8_4_ = fVar327 - fVar327;
      auVar203._12_4_ = fVar328 - fVar328;
      auVar252._0_8_ = CONCAT44((fVar305 - fVar272) * 3.0,(fVar325 - fVar240) * 3.0);
      auVar252._8_4_ = (fVar327 - fVar319) * 3.0;
      auVar252._12_4_ = (fVar328 - fVar302) * 3.0;
      auVar170._0_8_ = CONCAT44((fVar163 - fVar305) * 3.0,(fVar162 - fVar325) * 3.0);
      auVar170._8_4_ = (fVar175 - fVar327) * 3.0;
      auVar170._12_4_ = (fVar176 - fVar328) * 3.0;
      auVar279._0_4_ = (fVar299 - fVar162) * 3.0;
      auVar279._4_4_ = (fVar321 - fVar163) * 3.0;
      auVar279._8_4_ = (fVar284 - fVar175) * 3.0;
      auVar279._12_4_ = (fVar298 - fVar176) * 3.0;
      auVar224._8_4_ = auVar170._8_4_;
      auVar224._0_8_ = auVar170._0_8_;
      auVar224._12_4_ = auVar170._12_4_;
      auVar140 = minps(auVar224,auVar279);
      auVar71 = maxps(auVar170,auVar279);
      auVar263._8_4_ = auVar252._8_4_;
      auVar263._0_8_ = auVar252._0_8_;
      auVar263._12_4_ = auVar252._12_4_;
      auVar142 = minps(auVar263,auVar140);
      auVar246 = maxps(auVar252,auVar71);
      auVar28._4_8_ = auVar71._8_8_;
      auVar28._0_4_ = auVar142._4_4_;
      auVar171._0_8_ = auVar28._0_8_ << 0x20;
      auVar171._8_4_ = auVar142._8_4_;
      auVar171._12_4_ = auVar142._12_4_;
      auVar172._8_8_ = auVar142._8_8_;
      auVar172._0_8_ = auVar171._8_8_;
      auVar29._4_8_ = auVar140._8_8_;
      auVar29._0_4_ = auVar246._4_4_;
      auVar225._0_8_ = auVar29._0_8_ << 0x20;
      auVar225._8_4_ = auVar246._8_4_;
      auVar225._12_4_ = auVar246._12_4_;
      auVar226._8_8_ = auVar246._8_8_;
      auVar226._0_8_ = auVar225._8_8_;
      auVar140 = minps(auVar142,auVar172);
      auVar71 = maxps(auVar246,auVar226);
      fVar286 = auVar140._0_4_ * fVar161;
      fVar289 = auVar140._4_4_ * fVar161;
      fVar300 = auVar140._8_4_ * fVar161;
      fVar303 = auVar140._12_4_ * fVar161;
      fVar327 = fVar161 * auVar71._0_4_;
      fVar162 = fVar161 * auVar71._4_4_;
      fVar175 = fVar161 * auVar71._8_4_;
      fVar161 = fVar161 * auVar71._12_4_;
      fVar181 = 1.0 / (fVar136 - fVar110);
      auVar98._0_8_ = CONCAT44(fVar302 - fVar272,fVar319 - fVar240);
      auVar98._8_4_ = fVar319 - fVar319;
      auVar98._12_4_ = fVar302 - fVar302;
      auVar234._8_4_ = auVar98._8_4_;
      auVar234._0_8_ = auVar98._0_8_;
      auVar234._12_4_ = auVar98._12_4_;
      auVar246 = minps(auVar234,auVar203);
      auVar71 = maxps(auVar98,auVar203);
      auVar148._8_4_ = auVar157._8_4_;
      auVar148._0_8_ = auVar157._0_8_;
      auVar148._12_4_ = auVar157._12_4_;
      auVar140 = minps(auVar148,auVar129);
      auVar246 = minps(auVar246,auVar140);
      auVar140 = maxps(auVar157,auVar129);
      auVar71 = maxps(auVar71,auVar140);
      fVar179 = auVar246._0_4_ * fVar181;
      fVar180 = auVar246._4_4_ * fVar181;
      fVar257 = fVar181 * auVar71._0_4_;
      fVar181 = fVar181 * auVar71._4_4_;
      local_508._4_4_ = fVar110;
      local_508._0_4_ = fVar137;
      fStack_500 = fVar160;
      fStack_4fc = fVar136;
      auVar227._4_4_ = fVar136;
      auVar227._0_4_ = fVar160;
      auVar227._8_4_ = fVar210;
      auVar227._12_4_ = fVar208;
      fVar321 = (fVar137 + fVar160) * 0.5;
      fVar302 = (fVar110 + fVar136) * 0.5;
      fVar325 = (fVar160 + fVar210) * 0.0;
      fVar305 = (fVar136 + fVar208) * 0.0;
      fVar230 = local_128 * fVar321 + fVar213;
      fVar240 = fStack_124 * fVar321 + fVar214;
      fVar272 = fStack_120 * fVar321 + 0.0;
      fVar284 = fStack_11c * fVar321 + 0.0;
      fVar285 = local_138 * fVar321 + fVar267;
      fVar298 = fStack_134 * fVar321 + fVar269;
      fVar319 = fStack_130 * fVar321 + fVar301;
      fVar299 = fStack_12c * fVar321 + fVar308;
      fVar230 = (fVar285 - fVar230) * fVar321 + fVar230;
      fVar240 = (fVar298 - fVar240) * fVar321 + fVar240;
      fVar272 = (fVar319 - fVar272) * fVar321 + fVar272;
      fVar284 = (fVar299 - fVar284) * fVar321 + fVar284;
      fVar285 = (((local_148 * fVar321 + fVar323) - fVar285) * fVar321 + fVar285) - fVar230;
      fVar298 = (((fStack_144 * fVar321 + fVar288) - fVar298) * fVar321 + fVar298) - fVar240;
      fVar319 = (((fStack_140 * fVar321 + fVar304) - fVar319) * fVar321 + fVar319) - fVar272;
      fVar299 = (((fStack_13c * fVar321 + fVar315) - fVar299) * fVar321 + fVar299) - fVar284;
      fVar230 = fVar321 * fVar285 + fVar230;
      fVar240 = fVar321 * fVar298 + fVar240;
      fVar285 = fVar285 * 3.0;
      fVar298 = fVar298 * 3.0;
      fVar272 = (fVar321 * fVar319 + fVar272) - fVar230;
      fVar284 = (fVar321 * fVar299 + fVar284) - fVar240;
      fVar285 = (fVar319 * 3.0 - fVar285) * fVar302 + fVar285;
      fVar298 = (fVar299 * 3.0 - fVar298) * fVar302 + fVar298;
      auVar158._0_8_ = CONCAT44(fVar285,fVar272) ^ 0x80000000;
      auVar158._8_4_ = fVar285;
      auVar158._12_4_ = fVar285;
      fVar306 = fVar137 - fVar321;
      fVar309 = fVar110 - fVar302;
      fVar311 = fVar160 - fVar325;
      fVar316 = fVar136 - fVar305;
      fVar318 = fVar160 - fVar321;
      fVar320 = fVar136 - fVar302;
      fVar210 = fVar210 - fVar325;
      fVar208 = fVar208 - fVar305;
      fVar230 = fVar272 * fVar302 + fVar230;
      fVar240 = fVar284 * fVar302 + fVar240;
      auVar173._0_8_ = CONCAT44(fVar298,fVar284) ^ 0x8000000000000000;
      auVar173._8_4_ = -fVar298;
      auVar173._12_4_ = -fVar298;
      auVar99._0_4_ = fVar284 * fVar285 - fVar298 * fVar272;
      auVar99._4_4_ = auVar99._0_4_;
      auVar99._8_4_ = auVar99._0_4_;
      auVar99._12_4_ = auVar99._0_4_;
      auVar140 = divps(auVar173,auVar99);
      auVar71 = divps(auVar158,auVar99);
      fVar325 = auVar140._0_4_;
      fVar305 = auVar140._4_4_;
      fVar319 = auVar71._0_4_;
      fVar299 = auVar71._4_4_;
      fVar321 = fVar321 - (fVar240 * fVar319 + fVar230 * fVar325);
      fVar285 = fVar302 - (fVar240 * fVar299 + fVar230 * fVar305);
      fVar298 = fVar302 - (fVar240 * auVar71._8_4_ + fVar230 * auVar140._8_4_);
      fVar302 = fVar302 - (fVar240 * auVar71._12_4_ + fVar230 * auVar140._12_4_);
      auVar130._0_8_ = CONCAT44(fVar305 * fVar179,fVar305 * fVar286);
      auVar130._8_4_ = fVar305 * fVar289;
      auVar130._12_4_ = fVar305 * fVar180;
      auVar100._0_4_ = fVar305 * fVar327;
      auVar100._4_4_ = fVar305 * fVar257;
      auVar100._8_4_ = fVar305 * fVar162;
      auVar100._12_4_ = fVar305 * fVar181;
      auVar333._8_4_ = auVar130._8_4_;
      auVar333._0_8_ = auVar130._0_8_;
      auVar333._12_4_ = auVar130._12_4_;
      auVar142 = minps(auVar333,auVar100);
      auVar71 = maxps(auVar100,auVar130);
      auVar204._0_8_ = CONCAT44(fVar299 * fVar180,fVar299 * fVar289);
      auVar204._8_4_ = fVar299 * fVar300;
      auVar204._12_4_ = fVar299 * fVar303;
      auVar131._0_4_ = fVar299 * fVar162;
      auVar131._4_4_ = fVar299 * fVar181;
      auVar131._8_4_ = fVar299 * fVar175;
      auVar131._12_4_ = fVar299 * fVar161;
      auVar264._8_4_ = auVar204._8_4_;
      auVar264._0_8_ = auVar204._0_8_;
      auVar264._12_4_ = auVar204._12_4_;
      auVar246 = minps(auVar264,auVar131);
      auVar140 = maxps(auVar131,auVar204);
      fVar230 = 0.0 - (auVar140._0_4_ + auVar71._0_4_);
      fVar240 = 1.0 - (auVar140._4_4_ + auVar71._4_4_);
      fVar272 = 0.0 - (auVar140._8_4_ + auVar71._8_4_);
      fVar284 = 0.0 - (auVar140._12_4_ + auVar71._12_4_);
      fVar328 = 0.0 - (auVar246._0_4_ + auVar142._0_4_);
      fVar163 = 1.0 - (auVar246._4_4_ + auVar142._4_4_);
      fVar176 = 0.0 - (auVar246._8_4_ + auVar142._8_4_);
      fVar178 = 0.0 - (auVar246._12_4_ + auVar142._12_4_);
      auVar132._0_8_ = CONCAT44(fVar309 * fVar240,fVar306 * fVar230);
      auVar132._8_4_ = fVar311 * fVar272;
      auVar132._12_4_ = fVar316 * fVar284;
      auVar280._0_8_ = CONCAT44(fVar179 * fVar325,fVar286 * fVar325);
      auVar280._8_4_ = fVar289 * fVar325;
      auVar280._12_4_ = fVar180 * fVar325;
      auVar205._0_4_ = fVar325 * fVar327;
      auVar205._4_4_ = fVar325 * fVar257;
      auVar205._8_4_ = fVar325 * fVar162;
      auVar205._12_4_ = fVar325 * fVar181;
      auVar265._8_4_ = auVar280._8_4_;
      auVar265._0_8_ = auVar280._0_8_;
      auVar265._12_4_ = auVar280._12_4_;
      auVar140 = minps(auVar265,auVar205);
      auVar71 = maxps(auVar205,auVar280);
      auVar235._0_8_ = CONCAT44(fVar180 * fVar319,fVar289 * fVar319);
      auVar235._8_4_ = fVar300 * fVar319;
      auVar235._12_4_ = fVar303 * fVar319;
      auVar281._0_4_ = fVar319 * fVar162;
      auVar281._4_4_ = fVar319 * fVar181;
      auVar281._8_4_ = fVar319 * fVar175;
      auVar281._12_4_ = fVar319 * fVar161;
      auVar332._8_4_ = auVar235._8_4_;
      auVar332._0_8_ = auVar235._0_8_;
      auVar332._12_4_ = auVar235._12_4_;
      auVar142 = minps(auVar332,auVar281);
      auVar266._0_4_ = fVar306 * fVar328;
      auVar266._4_4_ = fVar309 * fVar163;
      auVar266._8_4_ = fVar311 * fVar176;
      auVar266._12_4_ = fVar316 * fVar178;
      auVar101._0_8_ = CONCAT44(fVar240 * fVar320,fVar230 * fVar318);
      auVar101._8_4_ = fVar272 * fVar210;
      auVar101._12_4_ = fVar284 * fVar208;
      auVar212._0_4_ = fVar328 * fVar318;
      auVar212._4_4_ = fVar163 * fVar320;
      auVar212._8_4_ = fVar176 * fVar210;
      auVar212._12_4_ = fVar178 * fVar208;
      auVar246 = maxps(auVar281,auVar235);
      fVar161 = 1.0 - (auVar246._0_4_ + auVar71._0_4_);
      fVar230 = 0.0 - (auVar246._4_4_ + auVar71._4_4_);
      fVar240 = 0.0 - (auVar246._8_4_ + auVar71._8_4_);
      fVar272 = 0.0 - (auVar246._12_4_ + auVar71._12_4_);
      fVar284 = 1.0 - (auVar142._0_4_ + auVar140._0_4_);
      fVar327 = 0.0 - (auVar142._4_4_ + auVar140._4_4_);
      fVar328 = 0.0 - (auVar142._8_4_ + auVar140._8_4_);
      fVar162 = 0.0 - (auVar142._12_4_ + auVar140._12_4_);
      auVar236._0_8_ = CONCAT44(fVar309 * fVar230,fVar306 * fVar161);
      auVar236._8_4_ = fVar311 * fVar240;
      auVar236._12_4_ = fVar316 * fVar272;
      auVar297._0_4_ = fVar306 * fVar284;
      auVar297._4_4_ = fVar309 * fVar327;
      auVar297._8_4_ = fVar311 * fVar328;
      auVar297._12_4_ = fVar316 * fVar162;
      auVar206._0_8_ = CONCAT44(fVar230 * fVar320,fVar161 * fVar318);
      auVar206._8_4_ = fVar240 * fVar210;
      auVar206._12_4_ = fVar272 * fVar208;
      auVar253._0_4_ = fVar284 * fVar318;
      auVar253._4_4_ = fVar327 * fVar320;
      auVar253._8_4_ = fVar328 * fVar210;
      auVar253._12_4_ = fVar162 * fVar208;
      auVar282._8_4_ = auVar236._8_4_;
      auVar282._0_8_ = auVar236._0_8_;
      auVar282._12_4_ = auVar236._12_4_;
      auVar71 = minps(auVar282,auVar297);
      auVar314._8_4_ = auVar206._8_4_;
      auVar314._0_8_ = auVar206._0_8_;
      auVar314._12_4_ = auVar206._12_4_;
      auVar140 = minps(auVar314,auVar253);
      auVar248 = minps(auVar71,auVar140);
      auVar140 = maxps(auVar297,auVar236);
      auVar71 = maxps(auVar253,auVar206);
      auVar246 = maxps(auVar71,auVar140);
      auVar237._8_4_ = auVar132._8_4_;
      auVar237._0_8_ = auVar132._0_8_;
      auVar237._12_4_ = auVar132._12_4_;
      auVar140 = minps(auVar237,auVar266);
      auVar207._8_4_ = auVar101._8_4_;
      auVar207._0_8_ = auVar101._0_8_;
      auVar207._12_4_ = auVar101._12_4_;
      auVar71 = minps(auVar207,auVar212);
      auVar140 = minps(auVar140,auVar71);
      auVar142 = maxps(auVar266,auVar132);
      auVar71 = maxps(auVar212,auVar101);
      auVar71 = maxps(auVar71,auVar142);
      auVar238._0_4_ = auVar248._4_4_ + auVar248._0_4_ + fVar321;
      auVar238._4_4_ = auVar140._4_4_ + auVar140._0_4_ + fVar285;
      auVar238._8_4_ = auVar248._8_4_ + auVar248._4_4_ + fVar298;
      auVar238._12_4_ = auVar248._12_4_ + auVar140._4_4_ + fVar302;
      fVar161 = auVar246._4_4_ + auVar246._0_4_ + fVar321;
      fVar208 = auVar71._4_4_ + auVar71._0_4_ + fVar285;
      auVar102._4_4_ = fVar208;
      auVar102._0_4_ = fVar161;
      auVar140 = maxps(_local_508,auVar238);
      auVar102._8_4_ = auVar246._8_4_ + auVar246._4_4_ + fVar298;
      auVar102._12_4_ = auVar246._12_4_ + auVar71._4_4_ + fVar302;
      auVar71 = minps(auVar102,auVar227);
      iVar64 = -(uint)(auVar71._0_4_ < auVar140._0_4_);
      iVar66 = -(uint)(auVar71._4_4_ < auVar140._4_4_);
      auVar104._4_4_ = iVar66;
      auVar104._0_4_ = iVar64;
      auVar104._8_4_ = iVar66;
      auVar104._12_4_ = iVar66;
      auVar103._8_8_ = auVar104._8_8_;
      auVar103._4_4_ = iVar64;
      auVar103._0_4_ = iVar64;
      iVar64 = movmskpd((uint)(fVar256 < 0.0),auVar103);
      auVar92 = _local_508;
      if (iVar64 == 0) {
        bVar53 = 0;
        if ((fVar137 < auVar238._0_4_) && (fVar161 < fVar160)) {
          bVar53 = -(fVar208 < fVar136) & fVar110 < auVar238._4_4_;
        }
        bVar53 = bVar62 | bVar53;
        uVar56 = (ulong)CONCAT31(uVar27,bVar53);
        if (bVar53 != 1) goto LAB_00b54a54;
        uVar56 = 200;
        do {
          fVar110 = 1.0 - fVar321;
          fVar161 = fVar321 * fVar321 * fVar321;
          fVar160 = fVar321 * fVar321 * 3.0 * fVar110;
          fVar136 = fVar110 * fVar110 * fVar110;
          fVar208 = fVar321 * 3.0 * fVar110 * fVar110;
          fVar137 = fVar136 * fVar213 + fVar208 * fVar267 + fVar160 * fVar323 + fVar161 * fVar215;
          fVar110 = fVar136 * fVar214 + fVar208 * fVar269 + fVar160 * fVar288 + fVar161 * fVar228;
          fVar137 = ((fVar136 * 0.0 + fVar208 * fVar301 + fVar160 * fVar304 + fVar161 * fVar150) -
                    fVar137) * fVar285 + fVar137;
          fVar110 = ((fVar136 * 0.0 + fVar208 * fVar308 + fVar160 * fVar315 + fVar161 * fVar70) -
                    fVar110) * fVar285 + fVar110;
          fVar321 = fVar321 - (fVar110 * fVar319 + fVar137 * fVar325);
          fVar285 = fVar285 - (fVar110 * fVar299 + fVar137 * fVar305);
          fVar137 = (float)((uint)fVar137 & (uint)DAT_01f7b6c0);
          fVar110 = (float)((uint)fVar110 & DAT_01f7b6c0._4_4_);
          if (fVar110 <= fVar137) {
            fVar110 = fVar137;
          }
          if (fVar110 < local_118) {
            if ((((0.0 <= fVar321) && (fVar321 <= 1.0)) && (0.0 <= fVar285)) && (fVar285 <= 1.0)) {
              fVar110 = pre->ray_space[k].vx.field_0.m128[2];
              fVar136 = pre->ray_space[k].vy.field_0.m128[2];
              fVar137 = pre->ray_space[k].vz.field_0.m128[2];
              fVar240 = 1.0 - fVar285;
              fVar230 = 1.0 - fVar321;
              fVar160 = fVar230 * fVar230 * fVar230;
              fVar161 = fVar321 * 3.0 * fVar230 * fVar230;
              fVar210 = fVar321 * fVar321 * fVar321;
              fVar208 = fVar321 * fVar321 * 3.0 * fVar230;
              fVar110 = ((fStack_150 * fVar137 + fStack_154 * fVar136 + local_158 * fVar110) *
                         fVar240 +
                        (fStack_190 * fVar137 + fStack_194 * fVar136 + local_198 * fVar110) *
                        fVar285) * fVar160 +
                        ((fStack_160 * fVar137 + fStack_164 * fVar136 + local_168 * fVar110) *
                         fVar240 +
                        (fStack_1a0 * fVar137 + fStack_1a4 * fVar136 + local_1a8 * fVar110) *
                        fVar285) * fVar161 +
                        ((fStack_170 * fVar137 + fStack_174 * fVar136 + local_178 * fVar110) *
                         fVar240 +
                        (fStack_1b0 * fVar137 + fStack_1b4 * fVar136 + local_1b8 * fVar110) *
                        fVar285) * fVar208 +
                        (fVar240 * (fStack_180 * fVar137 +
                                   fStack_184 * fVar136 + local_188 * fVar110) +
                        (fVar137 * fStack_1c0 + fVar136 * fStack_1c4 + fVar110 * local_1c8) *
                        fVar285) * fVar210;
              if ((fVar109 <= fVar110) &&
                 (fVar136 = *(float *)(ray + k * 4 + 0x80), fVar110 <= fVar136)) {
                fVar272 = 1.0 - fVar285;
                fVar284 = 1.0 - fVar285;
                fVar298 = 1.0 - fVar285;
                fVar137 = fVar312 * fVar272 + fVar239 * fVar285;
                fVar240 = fVar310 * fVar284 + fVar283 * fVar285;
                fVar256 = fVar317 * fVar298 + fVar287 * fVar285;
                fVar319 = fVar254 * fVar272 + fVar108 * fVar285;
                fVar302 = fVar255 * fVar284 + fVar209 * fVar285;
                fVar305 = fVar307 * fVar298 + fVar159 * fVar285;
                fVar299 = fVar319 - fVar137;
                fVar325 = fVar302 - fVar240;
                fVar327 = fVar305 - fVar256;
                fVar137 = (((fVar137 - (fVar268 * fVar272 + fVar138 * fVar285)) * fVar230 +
                           fVar321 * fVar299) * fVar230 +
                          (fVar299 * fVar230 +
                          ((fVar272 * fVar174 + local_298 * fVar285) - fVar319) * fVar321) * fVar321
                          ) * 3.0;
                fVar240 = (((fVar240 - (fVar270 * fVar284 + fVar149 * fVar285)) * fVar230 +
                           fVar321 * fVar325) * fVar230 +
                          (fVar325 * fVar230 +
                          ((fVar284 * fVar177 + fStack_294 * fVar285) - fVar302) * fVar321) *
                          fVar321) * 3.0;
                fVar230 = (((fVar256 - (fVar271 * fVar298 + fVar151 * fVar285)) * fVar230 +
                           fVar321 * fVar327) * fVar230 +
                          (fVar327 * fVar230 +
                          ((fVar298 * fVar182 + fStack_290 * fVar285) - fVar305) * fVar321) *
                          fVar321) * 3.0;
                pGVar16 = (context->scene->geometries).items[uVar65].ptr;
                uVar56 = (ulong)*(uint *)(ray + k * 4 + 0x90);
                if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar256 = fVar160 * local_2a8 +
                            fVar161 * local_2b8 + fVar208 * local_2c8 + fVar210 * local_2d8;
                  fVar272 = fVar160 * fStack_2a4 +
                            fVar161 * fStack_2b4 + fVar208 * fStack_2c4 + fVar210 * fStack_2d4;
                  fVar160 = fVar160 * fStack_2a0 +
                            fVar161 * fStack_2b0 + fVar208 * fStack_2c0 + fVar210 * fStack_2d0;
                  fVar161 = fVar272 * fVar137 - fVar240 * fVar256;
                  fVar208 = fVar160 * fVar240 - fVar230 * fVar272;
                  fVar137 = fVar256 * fVar230 - fVar137 * fVar160;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar16->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar110;
                    *(float *)(ray + k * 4 + 0xc0) = fVar208;
                    *(float *)(ray + k * 4 + 0xd0) = fVar137;
                    *(float *)(ray + k * 4 + 0xe0) = fVar161;
                    *(float *)(ray + k * 4 + 0xf0) = fVar321;
                    *(float *)(ray + k * 4 + 0x100) = fVar285;
                    *(uint *)(ray + k * 4 + 0x110) = uVar67;
                    *(uint *)(ray + k * 4 + 0x120) = uVar65;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    uVar68 = context->user->instPrimID[0];
                    uVar56 = (ulong)uVar68;
                    *(uint *)(ray + k * 4 + 0x140) = uVar68;
                  }
                  else {
                    local_e8 = fVar208;
                    fStack_e4 = fVar208;
                    fStack_e0 = fVar208;
                    fStack_dc = fVar208;
                    local_d8 = fVar137;
                    fStack_d4 = fVar137;
                    fStack_d0 = fVar137;
                    fStack_cc = fVar137;
                    local_c8 = fVar161;
                    fStack_c4 = fVar161;
                    fStack_c0 = fVar161;
                    fStack_bc = fVar161;
                    local_b8 = fVar321;
                    fStack_b4 = fVar321;
                    fStack_b0 = fVar321;
                    fStack_ac = fVar321;
                    local_a8 = fVar285;
                    fStack_a4 = fVar285;
                    fStack_a0 = fVar285;
                    fStack_9c = fVar285;
                    local_98 = CONCAT44(uStack_304,local_308);
                    uStack_90 = CONCAT44(uStack_2fc,uStack_300);
                    local_88 = CONCAT44(uStack_2f4,local_2f8);
                    uStack_80 = CONCAT44(uStack_2ec,uStack_2f0);
                    local_78 = context->user->instID[0];
                    uStack_74 = local_78;
                    uStack_70 = local_78;
                    uStack_6c = local_78;
                    local_68 = context->user->instPrimID[0];
                    uStack_64 = local_68;
                    uStack_60 = local_68;
                    uStack_5c = local_68;
                    *(float *)(ray + k * 4 + 0x80) = fVar110;
                    local_3a8 = *local_390;
                    local_378.valid = (int *)local_3a8;
                    local_378.geometryUserPtr = pGVar16->userPtr;
                    local_378.context = context->user;
                    local_378.hit = (RTCHitN *)&local_e8;
                    local_378.N = 4;
                    p_Var57 = pGVar16->intersectionFilterN;
                    local_378.ray = (RTCRayN *)ray;
                    if (p_Var57 != (RTCFilterFunctionN)0x0) {
                      p_Var57 = (RTCFilterFunctionN)(*p_Var57)(&local_378);
                      ray = local_4f8;
                    }
                    auVar133._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                    auVar133._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                    auVar133._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                    auVar133._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                    uVar68 = movmskps((int)p_Var57,auVar133);
                    pRVar58 = (RayHitK<4> *)(ulong)(uVar68 ^ 0xf);
                    if ((uVar68 ^ 0xf) == 0) {
                      auVar133 = auVar133 ^ _DAT_01f7ae20;
                    }
                    else {
                      p_Var57 = context->args->filter;
                      if ((p_Var57 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                        p_Var57 = (RTCFilterFunctionN)(*p_Var57)(&local_378);
                        ray = local_4f8;
                      }
                      auVar105._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                      auVar105._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                      auVar105._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                      auVar105._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                      auVar133 = auVar105 ^ _DAT_01f7ae20;
                      uVar68 = movmskps((int)p_Var57,auVar105);
                      pRVar58 = (RayHitK<4> *)(ulong)(uVar68 ^ 0xf);
                      if ((uVar68 ^ 0xf) != 0) {
                        fVar110 = *(float *)(local_378.hit + 4);
                        fVar137 = *(float *)(local_378.hit + 8);
                        fVar160 = *(float *)(local_378.hit + 0xc);
                        *(uint *)(local_378.ray + 0xc0) =
                             ~auVar105._0_4_ & (uint)*(float *)local_378.hit |
                             *(uint *)(local_378.ray + 0xc0) & auVar105._0_4_;
                        *(uint *)(local_378.ray + 0xc4) =
                             ~auVar105._4_4_ & (uint)fVar110 |
                             *(uint *)(local_378.ray + 0xc4) & auVar105._4_4_;
                        *(uint *)(local_378.ray + 200) =
                             ~auVar105._8_4_ & (uint)fVar137 |
                             *(uint *)(local_378.ray + 200) & auVar105._8_4_;
                        *(uint *)(local_378.ray + 0xcc) =
                             ~auVar105._12_4_ & (uint)fVar160 |
                             *(uint *)(local_378.ray + 0xcc) & auVar105._12_4_;
                        fVar110 = *(float *)(local_378.hit + 0x14);
                        fVar137 = *(float *)(local_378.hit + 0x18);
                        fVar160 = *(float *)(local_378.hit + 0x1c);
                        *(uint *)(local_378.ray + 0xd0) =
                             ~auVar105._0_4_ & (uint)*(float *)(local_378.hit + 0x10) |
                             *(uint *)(local_378.ray + 0xd0) & auVar105._0_4_;
                        *(uint *)(local_378.ray + 0xd4) =
                             ~auVar105._4_4_ & (uint)fVar110 |
                             *(uint *)(local_378.ray + 0xd4) & auVar105._4_4_;
                        *(uint *)(local_378.ray + 0xd8) =
                             ~auVar105._8_4_ & (uint)fVar137 |
                             *(uint *)(local_378.ray + 0xd8) & auVar105._8_4_;
                        *(uint *)(local_378.ray + 0xdc) =
                             ~auVar105._12_4_ & (uint)fVar160 |
                             *(uint *)(local_378.ray + 0xdc) & auVar105._12_4_;
                        fVar110 = *(float *)(local_378.hit + 0x24);
                        fVar137 = *(float *)(local_378.hit + 0x28);
                        fVar160 = *(float *)(local_378.hit + 0x2c);
                        *(uint *)(local_378.ray + 0xe0) =
                             ~auVar105._0_4_ & (uint)*(float *)(local_378.hit + 0x20) |
                             *(uint *)(local_378.ray + 0xe0) & auVar105._0_4_;
                        *(uint *)(local_378.ray + 0xe4) =
                             ~auVar105._4_4_ & (uint)fVar110 |
                             *(uint *)(local_378.ray + 0xe4) & auVar105._4_4_;
                        *(uint *)(local_378.ray + 0xe8) =
                             ~auVar105._8_4_ & (uint)fVar137 |
                             *(uint *)(local_378.ray + 0xe8) & auVar105._8_4_;
                        *(uint *)(local_378.ray + 0xec) =
                             ~auVar105._12_4_ & (uint)fVar160 |
                             *(uint *)(local_378.ray + 0xec) & auVar105._12_4_;
                        fVar110 = *(float *)(local_378.hit + 0x34);
                        fVar137 = *(float *)(local_378.hit + 0x38);
                        fVar160 = *(float *)(local_378.hit + 0x3c);
                        *(uint *)(local_378.ray + 0xf0) =
                             ~auVar105._0_4_ & (uint)*(float *)(local_378.hit + 0x30) |
                             *(uint *)(local_378.ray + 0xf0) & auVar105._0_4_;
                        *(uint *)(local_378.ray + 0xf4) =
                             ~auVar105._4_4_ & (uint)fVar110 |
                             *(uint *)(local_378.ray + 0xf4) & auVar105._4_4_;
                        *(uint *)(local_378.ray + 0xf8) =
                             ~auVar105._8_4_ & (uint)fVar137 |
                             *(uint *)(local_378.ray + 0xf8) & auVar105._8_4_;
                        *(uint *)(local_378.ray + 0xfc) =
                             ~auVar105._12_4_ & (uint)fVar160 |
                             *(uint *)(local_378.ray + 0xfc) & auVar105._12_4_;
                        fVar110 = *(float *)(local_378.hit + 0x44);
                        fVar137 = *(float *)(local_378.hit + 0x48);
                        fVar160 = *(float *)(local_378.hit + 0x4c);
                        *(uint *)(local_378.ray + 0x100) =
                             ~auVar105._0_4_ & (uint)*(float *)(local_378.hit + 0x40) |
                             *(uint *)(local_378.ray + 0x100) & auVar105._0_4_;
                        *(uint *)(local_378.ray + 0x104) =
                             ~auVar105._4_4_ & (uint)fVar110 |
                             *(uint *)(local_378.ray + 0x104) & auVar105._4_4_;
                        *(uint *)(local_378.ray + 0x108) =
                             ~auVar105._8_4_ & (uint)fVar137 |
                             *(uint *)(local_378.ray + 0x108) & auVar105._8_4_;
                        *(uint *)(local_378.ray + 0x10c) =
                             ~auVar105._12_4_ & (uint)fVar160 |
                             *(uint *)(local_378.ray + 0x10c) & auVar105._12_4_;
                        fVar110 = *(float *)(local_378.hit + 0x54);
                        fVar137 = *(float *)(local_378.hit + 0x58);
                        fVar160 = *(float *)(local_378.hit + 0x5c);
                        *(uint *)(local_378.ray + 0x110) =
                             *(uint *)(local_378.ray + 0x110) & auVar105._0_4_ |
                             ~auVar105._0_4_ & (uint)*(float *)(local_378.hit + 0x50);
                        *(uint *)(local_378.ray + 0x114) =
                             *(uint *)(local_378.ray + 0x114) & auVar105._4_4_ |
                             ~auVar105._4_4_ & (uint)fVar110;
                        *(uint *)(local_378.ray + 0x118) =
                             *(uint *)(local_378.ray + 0x118) & auVar105._8_4_ |
                             ~auVar105._8_4_ & (uint)fVar137;
                        *(uint *)(local_378.ray + 0x11c) =
                             *(uint *)(local_378.ray + 0x11c) & auVar105._12_4_ |
                             ~auVar105._12_4_ & (uint)fVar160;
                        fVar110 = *(float *)(local_378.hit + 100);
                        fVar137 = *(float *)(local_378.hit + 0x68);
                        fVar160 = *(float *)(local_378.hit + 0x6c);
                        *(uint *)(local_378.ray + 0x120) =
                             *(uint *)(local_378.ray + 0x120) & auVar105._0_4_ |
                             ~auVar105._0_4_ & (uint)*(float *)(local_378.hit + 0x60);
                        *(uint *)(local_378.ray + 0x124) =
                             *(uint *)(local_378.ray + 0x124) & auVar105._4_4_ |
                             ~auVar105._4_4_ & (uint)fVar110;
                        *(uint *)(local_378.ray + 0x128) =
                             *(uint *)(local_378.ray + 0x128) & auVar105._8_4_ |
                             ~auVar105._8_4_ & (uint)fVar137;
                        *(uint *)(local_378.ray + 300) =
                             *(uint *)(local_378.ray + 300) & auVar105._12_4_ |
                             ~auVar105._12_4_ & (uint)fVar160;
                        fVar110 = *(float *)(local_378.hit + 0x74);
                        fVar137 = *(float *)(local_378.hit + 0x78);
                        fVar160 = *(float *)(local_378.hit + 0x7c);
                        *(uint *)(local_378.ray + 0x130) =
                             ~auVar105._0_4_ & (uint)*(float *)(local_378.hit + 0x70) |
                             *(uint *)(local_378.ray + 0x130) & auVar105._0_4_;
                        *(uint *)(local_378.ray + 0x134) =
                             ~auVar105._4_4_ & (uint)fVar110 |
                             *(uint *)(local_378.ray + 0x134) & auVar105._4_4_;
                        *(uint *)(local_378.ray + 0x138) =
                             ~auVar105._8_4_ & (uint)fVar137 |
                             *(uint *)(local_378.ray + 0x138) & auVar105._8_4_;
                        *(uint *)(local_378.ray + 0x13c) =
                             ~auVar105._12_4_ & (uint)fVar160 |
                             *(uint *)(local_378.ray + 0x13c) & auVar105._12_4_;
                        *(undefined1 (*) [16])(local_378.ray + 0x140) =
                             ~auVar105 & *(undefined1 (*) [16])(local_378.hit + 0x80) |
                             *(undefined1 (*) [16])(local_378.ray + 0x140) & auVar105;
                        pRVar58 = (RayHitK<4> *)local_378.ray;
                      }
                    }
                    auVar134._0_4_ = auVar133._0_4_ << 0x1f;
                    auVar134._4_4_ = auVar133._4_4_ << 0x1f;
                    auVar134._8_4_ = auVar133._8_4_ << 0x1f;
                    auVar134._12_4_ = auVar133._12_4_ << 0x1f;
                    uVar68 = movmskps((int)pRVar58,auVar134);
                    uVar56 = (ulong)uVar68;
                    if (uVar68 == 0) {
                      *(float *)(ray + k * 4 + 0x80) = fVar136;
                    }
                  }
                }
              }
            }
            break;
          }
          uVar56 = uVar56 - 1;
        } while (uVar56 != 0);
      }
    }
  }
  goto LAB_00b550cf;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }